

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersector1<4>::
     occluded_t<embree::avx2::SweepCurve1Intersector1<embree::CatmullRomCurveT>,embree::avx2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  Primitive PVar3;
  Geometry *pGVar4;
  RTCFilterFunctionN p_Var5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  int iVar19;
  long lVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [12];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  byte bVar81;
  byte bVar82;
  uint uVar83;
  undefined1 (*pauVar84) [32];
  uint uVar85;
  uint uVar86;
  ulong uVar87;
  ulong uVar88;
  bool bVar89;
  int iVar90;
  ulong uVar91;
  bool bVar92;
  undefined4 uVar93;
  float fVar94;
  undefined8 uVar95;
  vint4 bi_2;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar101 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar145 [16];
  undefined1 auVar156 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [64];
  undefined1 auVar170 [64];
  vint4 ai_2;
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  vint4 ai;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  float fVar207;
  float fVar217;
  float fVar218;
  vint4 bi;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar219;
  float fVar220;
  float fVar221;
  float fVar222;
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  float fVar223;
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  float fVar226;
  undefined1 auVar228 [16];
  float fVar233;
  float fVar234;
  undefined1 auVar227 [16];
  float fVar236;
  float fVar237;
  undefined1 auVar229 [32];
  float fVar235;
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  float fVar238;
  float fVar250;
  float fVar251;
  vint4 ai_1;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  float fVar252;
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar241 [16];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [64];
  undefined1 auVar253 [16];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar257 [16];
  undefined1 auVar256 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  float fVar261;
  undefined1 auVar260 [32];
  undefined1 auVar262 [16];
  undefined1 auVar263 [32];
  undefined1 auVar264 [64];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  float fVar270;
  undefined1 auVar269 [64];
  float s;
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  float fVar279;
  float fVar280;
  float fVar281;
  undefined1 auVar277 [64];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [32];
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_ac4;
  int local_a44;
  undefined1 local_a40 [8];
  float fStack_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [16];
  undefined1 local_990 [8];
  float fStack_988;
  float fStack_984;
  undefined1 local_980 [16];
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  RTCFilterFunctionNArguments local_950;
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float fStack_908;
  float fStack_904;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  undefined1 auStack_890 [16];
  undefined8 local_880;
  undefined4 local_878;
  float local_874;
  undefined4 local_870;
  undefined4 local_86c;
  uint local_868;
  uint local_864;
  uint local_860;
  ulong local_848;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [16];
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [8];
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [32];
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined4 uStack_710;
  undefined4 uStack_70c;
  undefined4 uStack_708;
  undefined4 uStack_704;
  float local_700;
  float fStack_6fc;
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  uint local_6c0;
  uint uStack_6bc;
  uint uStack_6b8;
  uint uStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  uint uStack_6a4;
  undefined1 local_6a0 [16];
  undefined1 auStack_690 [16];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined4 uStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [16];
  undefined1 local_4b0 [16];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined4 local_3e0;
  undefined4 uStack_3dc;
  undefined4 uStack_3d8;
  undefined4 uStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  undefined4 uStack_3c4;
  undefined4 local_3c0;
  undefined4 uStack_3bc;
  undefined4 uStack_3b8;
  undefined4 uStack_3b4;
  undefined4 uStack_3b0;
  undefined4 uStack_3ac;
  undefined4 uStack_3a8;
  undefined4 uStack_3a4;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar278 [64];
  
  PVar3 = prim[1];
  uVar87 = (ulong)(byte)PVar3;
  fVar190 = *(float *)(prim + uVar87 * 0x19 + 0x12);
  auVar145 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                        *(undefined1 (*) [16])(prim + uVar87 * 0x19 + 6));
  auVar96._0_4_ = fVar190 * auVar145._0_4_;
  auVar96._4_4_ = fVar190 * auVar145._4_4_;
  auVar96._8_4_ = fVar190 * auVar145._8_4_;
  auVar96._12_4_ = fVar190 * auVar145._12_4_;
  auVar208._0_4_ = fVar190 * (ray->dir).field_0.m128[0];
  auVar208._4_4_ = fVar190 * (ray->dir).field_0.m128[1];
  auVar208._8_4_ = fVar190 * (ray->dir).field_0.m128[2];
  auVar208._12_4_ = fVar190 * (ray->dir).field_0.m128[3];
  auVar145 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 4 + 6)));
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar107 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 5 + 6)));
  auVar107 = vcvtdq2ps_avx(auVar107);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar257 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar87 * 0xb + 6)));
  auVar257 = vcvtdq2ps_avx(auVar257);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar3 * 0xc + uVar87 + 6)));
  auVar228 = vcvtdq2ps_avx(auVar228);
  uVar91 = (ulong)(uint)((int)(uVar87 * 9) * 2);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + uVar87 + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  uVar91 = (ulong)(uint)((int)(uVar87 * 5) << 2);
  auVar144 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar91 + 6)));
  auVar144 = vcvtdq2ps_avx(auVar144);
  auVar277 = ZEXT1664(auVar144);
  auVar282._4_4_ = auVar208._0_4_;
  auVar282._0_4_ = auVar208._0_4_;
  auVar282._8_4_ = auVar208._0_4_;
  auVar282._12_4_ = auVar208._0_4_;
  auVar129 = vshufps_avx(auVar208,auVar208,0x55);
  auVar97 = vshufps_avx(auVar208,auVar208,0xaa);
  fVar190 = auVar97._0_4_;
  auVar262._0_4_ = fVar190 * auVar7._0_4_;
  fVar94 = auVar97._4_4_;
  auVar262._4_4_ = fVar94 * auVar7._4_4_;
  fVar226 = auVar97._8_4_;
  auVar262._8_4_ = fVar226 * auVar7._8_4_;
  fVar233 = auVar97._12_4_;
  auVar262._12_4_ = fVar233 * auVar7._12_4_;
  auVar256._0_4_ = auVar228._0_4_ * fVar190;
  auVar256._4_4_ = auVar228._4_4_ * fVar94;
  auVar256._8_4_ = auVar228._8_4_ * fVar226;
  auVar256._12_4_ = auVar228._12_4_ * fVar233;
  auVar239._0_4_ = auVar144._0_4_ * fVar190;
  auVar239._4_4_ = auVar144._4_4_ * fVar94;
  auVar239._8_4_ = auVar144._8_4_ * fVar226;
  auVar239._12_4_ = auVar144._12_4_ * fVar233;
  auVar97 = vfmadd231ps_fma(auVar262,auVar129,auVar107);
  auVar130 = vfmadd231ps_fma(auVar256,auVar129,auVar8);
  auVar129 = vfmadd231ps_fma(auVar239,auVar98,auVar129);
  auVar171 = vfmadd231ps_fma(auVar97,auVar282,auVar145);
  auVar264 = ZEXT1664(auVar171);
  auVar130 = vfmadd231ps_fma(auVar130,auVar282,auVar257);
  auVar192 = vfmadd231ps_fma(auVar129,auVar99,auVar282);
  auVar283._4_4_ = auVar96._0_4_;
  auVar283._0_4_ = auVar96._0_4_;
  auVar283._8_4_ = auVar96._0_4_;
  auVar283._12_4_ = auVar96._0_4_;
  auVar129 = vshufps_avx(auVar96,auVar96,0x55);
  auVar97 = vshufps_avx(auVar96,auVar96,0xaa);
  fVar190 = auVar97._0_4_;
  auVar209._0_4_ = fVar190 * auVar7._0_4_;
  fVar94 = auVar97._4_4_;
  auVar209._4_4_ = fVar94 * auVar7._4_4_;
  fVar226 = auVar97._8_4_;
  auVar209._8_4_ = fVar226 * auVar7._8_4_;
  fVar233 = auVar97._12_4_;
  auVar209._12_4_ = fVar233 * auVar7._12_4_;
  auVar128._0_4_ = auVar228._0_4_ * fVar190;
  auVar128._4_4_ = auVar228._4_4_ * fVar94;
  auVar128._8_4_ = auVar228._8_4_ * fVar226;
  auVar128._12_4_ = auVar228._12_4_ * fVar233;
  auVar97._0_4_ = auVar144._0_4_ * fVar190;
  auVar97._4_4_ = auVar144._4_4_ * fVar94;
  auVar97._8_4_ = auVar144._8_4_ * fVar226;
  auVar97._12_4_ = auVar144._12_4_ * fVar233;
  auVar107 = vfmadd231ps_fma(auVar209,auVar129,auVar107);
  auVar7 = vfmadd231ps_fma(auVar128,auVar129,auVar8);
  auVar8 = vfmadd231ps_fma(auVar97,auVar129,auVar98);
  auVar228 = vfmadd231ps_fma(auVar107,auVar283,auVar145);
  auVar98 = vfmadd231ps_fma(auVar7,auVar283,auVar257);
  auVar144 = vfmadd231ps_fma(auVar8,auVar283,auVar99);
  local_9a0._8_4_ = 0x7fffffff;
  local_9a0._0_8_ = 0x7fffffff7fffffff;
  local_9a0._12_4_ = 0x7fffffff;
  auVar145 = vandps_avx(auVar171,local_9a0);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar145 = vcmpps_avx(auVar145,auVar191,1);
  auVar107 = vblendvps_avx(auVar171,auVar191,auVar145);
  auVar145 = vandps_avx(auVar130,local_9a0);
  auVar145 = vcmpps_avx(auVar145,auVar191,1);
  auVar7 = vblendvps_avx(auVar130,auVar191,auVar145);
  auVar145 = vandps_avx(auVar192,local_9a0);
  auVar145 = vcmpps_avx(auVar145,auVar191,1);
  auVar145 = vblendvps_avx(auVar192,auVar191,auVar145);
  auVar257 = vrcpps_avx(auVar107);
  auVar227._8_4_ = 0x3f800000;
  auVar227._0_8_ = 0x3f8000003f800000;
  auVar227._12_4_ = 0x3f800000;
  auVar107 = vfnmadd213ps_fma(auVar107,auVar257,auVar227);
  auVar257 = vfmadd132ps_fma(auVar107,auVar257,auVar257);
  auVar107 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar107,auVar227);
  auVar8 = vfmadd132ps_fma(auVar7,auVar107,auVar107);
  auVar107 = vrcpps_avx(auVar145);
  auVar145 = vfnmadd213ps_fma(auVar145,auVar107,auVar227);
  auVar99 = vfmadd132ps_fma(auVar145,auVar107,auVar107);
  auVar145._8_8_ = 0;
  auVar145._0_8_ = *(ulong *)(prim + uVar87 * 7 + 6);
  auVar145 = vpmovsxwd_avx(auVar145);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar145 = vsubps_avx(auVar145,auVar228);
  auVar192._0_4_ = auVar257._0_4_ * auVar145._0_4_;
  auVar192._4_4_ = auVar257._4_4_ * auVar145._4_4_;
  auVar192._8_4_ = auVar257._8_4_ * auVar145._8_4_;
  auVar192._12_4_ = auVar257._12_4_ * auVar145._12_4_;
  auVar107._8_8_ = 0;
  auVar107._0_8_ = *(ulong *)(prim + uVar87 * 9 + 6);
  auVar145 = vpmovsxwd_avx(auVar107);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar145 = vsubps_avx(auVar145,auVar228);
  auVar210._0_4_ = auVar257._0_4_ * auVar145._0_4_;
  auVar210._4_4_ = auVar257._4_4_ * auVar145._4_4_;
  auVar210._8_4_ = auVar257._8_4_ * auVar145._8_4_;
  auVar210._12_4_ = auVar257._12_4_ * auVar145._12_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar3;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + 6);
  auVar107 = vpmovsxwd_avx(auVar7);
  auVar257._8_8_ = 0;
  auVar257._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar3 * 0x10 + uVar87 * -2 + 6);
  auVar145 = vpmovsxwd_avx(auVar257);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar145 = vsubps_avx(auVar145,auVar98);
  auVar240._0_4_ = auVar145._0_4_ * auVar8._0_4_;
  auVar240._4_4_ = auVar145._4_4_ * auVar8._4_4_;
  auVar240._8_4_ = auVar145._8_4_ * auVar8._8_4_;
  auVar240._12_4_ = auVar145._12_4_ * auVar8._12_4_;
  auVar145 = vcvtdq2ps_avx(auVar107);
  auVar145 = vsubps_avx(auVar145,auVar98);
  auVar129._0_4_ = auVar8._0_4_ * auVar145._0_4_;
  auVar129._4_4_ = auVar8._4_4_ * auVar145._4_4_;
  auVar129._8_4_ = auVar8._8_4_ * auVar145._8_4_;
  auVar129._12_4_ = auVar8._12_4_ * auVar145._12_4_;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + uVar91 + uVar87 + 6);
  auVar145 = vpmovsxwd_avx(auVar8);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar145 = vsubps_avx(auVar145,auVar144);
  auVar171._0_4_ = auVar99._0_4_ * auVar145._0_4_;
  auVar171._4_4_ = auVar99._4_4_ * auVar145._4_4_;
  auVar171._8_4_ = auVar99._8_4_ * auVar145._8_4_;
  auVar171._12_4_ = auVar99._12_4_ * auVar145._12_4_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar87 * 0x17 + 6);
  auVar145 = vpmovsxwd_avx(auVar228);
  auVar145 = vcvtdq2ps_avx(auVar145);
  auVar145 = vsubps_avx(auVar145,auVar144);
  auVar98._0_4_ = auVar99._0_4_ * auVar145._0_4_;
  auVar98._4_4_ = auVar99._4_4_ * auVar145._4_4_;
  auVar98._8_4_ = auVar99._8_4_ * auVar145._8_4_;
  auVar98._12_4_ = auVar99._12_4_ * auVar145._12_4_;
  auVar145 = vpminsd_avx(auVar192,auVar210);
  auVar107 = vpminsd_avx(auVar240,auVar129);
  auVar145 = vmaxps_avx(auVar145,auVar107);
  auVar107 = vpminsd_avx(auVar171,auVar98);
  uVar93 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar253._4_4_ = uVar93;
  auVar253._0_4_ = uVar93;
  auVar253._8_4_ = uVar93;
  auVar253._12_4_ = uVar93;
  auVar107 = vmaxps_avx(auVar107,auVar253);
  auVar145 = vmaxps_avx(auVar145,auVar107);
  local_4c0._0_4_ = auVar145._0_4_ * 0.99999964;
  local_4c0._4_4_ = auVar145._4_4_ * 0.99999964;
  local_4c0._8_4_ = auVar145._8_4_ * 0.99999964;
  local_4c0._12_4_ = auVar145._12_4_ * 0.99999964;
  auVar145 = vpmaxsd_avx(auVar192,auVar210);
  auVar107 = vpmaxsd_avx(auVar240,auVar129);
  auVar145 = vminps_avx(auVar145,auVar107);
  auVar107 = vpmaxsd_avx(auVar171,auVar98);
  fVar190 = ray->tfar;
  auVar144._4_4_ = fVar190;
  auVar144._0_4_ = fVar190;
  auVar144._8_4_ = fVar190;
  auVar144._12_4_ = fVar190;
  auVar107 = vminps_avx(auVar107,auVar144);
  auVar145 = vminps_avx(auVar145,auVar107);
  auVar99._0_4_ = auVar145._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar145._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar145._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar145._12_4_ * 1.0000004;
  auVar130[4] = PVar3;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar3;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar3;
  auVar130._13_3_ = 0;
  auVar107 = vpcmpgtd_avx(auVar130,_DAT_01f7fcf0);
  auVar145 = vcmpps_avx(local_4c0,auVar99,2);
  auVar145 = vandps_avx(auVar145,auVar107);
  uVar83 = vmovmskps_avx(auVar145);
  if (uVar83 == 0) {
    return false;
  }
  uVar83 = uVar83 & 0xff;
  auVar112._16_16_ = mm_lookupmask_ps._240_16_;
  auVar112._0_16_ = mm_lookupmask_ps._240_16_;
  local_400 = vblendps_avx(auVar112,ZEXT832(0) << 0x20,0x80);
  auVar269 = ZEXT3264(local_400);
  local_720 = 0x7fffffff;
  uStack_71c = 0x7fffffff;
  uStack_718 = 0x7fffffff;
  uStack_714 = 0x7fffffff;
  uStack_710 = 0x7fffffff;
  uStack_70c = 0x7fffffff;
  uStack_708 = 0x7fffffff;
  uStack_704 = 0x7fffffff;
  local_6c0 = 0x80000000;
  uStack_6bc = 0x80000000;
  uStack_6b8 = 0x80000000;
  uStack_6b4 = 0x80000000;
  fStack_6b0 = -0.0;
  fStack_6ac = -0.0;
  fStack_6a8 = -0.0;
  uStack_6a4 = 0x80000000;
  local_7b0 = prim;
LAB_01605026:
  lVar20 = 0;
  local_7a8 = (ulong)uVar83;
  for (uVar91 = local_7a8; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x8000000000000000) {
    lVar20 = lVar20 + 1;
  }
  uVar83 = *(uint *)(local_7b0 + 2);
  local_848 = (ulong)*(uint *)(local_7b0 + lVar20 * 4 + 6);
  pGVar4 = (context->scene->geometries).items[uVar83].ptr;
  uVar91 = (ulong)*(uint *)(*(long *)&pGVar4->field_0x58 +
                           pGVar4[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * local_848);
  p_Var5 = pGVar4[1].intersectionFilterN;
  lVar20 = *(long *)&pGVar4[1].time_range.upper;
  auVar145 = *(undefined1 (*) [16])(lVar20 + (long)p_Var5 * uVar91);
  auVar107 = *(undefined1 (*) [16])(lVar20 + (uVar91 + 1) * (long)p_Var5);
  local_7a8 = local_7a8 - 1 & local_7a8;
  if (local_7a8 != 0) {
    uVar88 = local_7a8 - 1 & local_7a8;
    for (uVar87 = local_7a8; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x8000000000000000) {
    }
    if (uVar88 != 0) {
      for (; (uVar88 & 1) == 0; uVar88 = uVar88 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar211._0_4_ = (auVar145._0_4_ + auVar107._0_4_) * 0.5;
  auVar211._4_4_ = (auVar145._4_4_ + auVar107._4_4_) * 0.5;
  auVar211._8_4_ = (auVar145._8_4_ + auVar107._8_4_) * 0.5;
  auVar211._12_4_ = (auVar145._12_4_ + auVar107._12_4_) * 0.5;
  aVar1 = (ray->org).field_0;
  aVar2 = (ray->dir).field_0.field_1;
  auVar7 = vsubps_avx(auVar211,(undefined1  [16])aVar1);
  auVar7 = vdpps_avx(auVar7,(undefined1  [16])aVar2,0x7f);
  auVar257 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  auVar8 = vrcpss_avx(auVar257,auVar257);
  auVar249 = ZEXT1664(auVar8);
  auVar257 = vfnmadd213ss_fma(auVar8,auVar257,ZEXT416(0x40000000));
  fVar190 = auVar7._0_4_ * auVar8._0_4_ * auVar257._0_4_;
  local_7c0 = ZEXT416((uint)fVar190);
  auVar212._4_4_ = fVar190;
  auVar212._0_4_ = fVar190;
  auVar212._8_4_ = fVar190;
  auVar212._12_4_ = fVar190;
  fStack_a30 = fVar190;
  _local_a40 = auVar212;
  fStack_a2c = fVar190;
  fStack_a28 = fVar190;
  fStack_a24 = fVar190;
  auVar7 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar212);
  auVar7 = vblendps_avx(auVar7,_DAT_01f7aa10,8);
  local_960 = vsubps_avx(auVar145,auVar7);
  local_970 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + (uVar91 + 2) * (long)p_Var5),auVar7);
  local_980 = vsubps_avx(auVar107,auVar7);
  _local_990 = vsubps_avx(*(undefined1 (*) [16])(lVar20 + (uVar91 + 3) * (long)p_Var5),auVar7);
  auVar169 = ZEXT1664(_local_990);
  auVar145 = vmovshdup_avx(local_960);
  local_280 = auVar145._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar145 = vshufps_avx(local_960,local_960,0xaa);
  local_1e0 = auVar145._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar145 = vshufps_avx(local_960,local_960,0xff);
  local_2a0 = auVar145._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar145 = vmovshdup_avx(local_980);
  local_200 = auVar145._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar145 = vshufps_avx(local_980,local_980,0xaa);
  local_2c0 = auVar145._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar145 = vshufps_avx(local_980,local_980,0xff);
  local_2e0 = auVar145._0_8_;
  uStack_2d8 = local_2e0;
  uStack_2d0 = local_2e0;
  uStack_2c8 = local_2e0;
  auVar145 = vmovshdup_avx(local_970);
  local_300 = auVar145._0_8_;
  uStack_2f8 = local_300;
  uStack_2f0 = local_300;
  uStack_2e8 = local_300;
  auVar145 = vshufps_avx(local_970,local_970,0xaa);
  local_320 = auVar145._0_8_;
  uStack_318 = local_320;
  uStack_310 = local_320;
  uStack_308 = local_320;
  auVar145 = vshufps_avx(local_970,local_970,0xff);
  local_340 = auVar145._0_8_;
  uStack_338 = local_340;
  uStack_330 = local_340;
  uStack_328 = local_340;
  auVar145 = vmovshdup_avx(_local_990);
  local_360 = auVar145._0_8_;
  uStack_358 = local_360;
  uStack_350 = local_360;
  uStack_348 = local_360;
  auVar145 = vshufps_avx(_local_990,_local_990,0xaa);
  local_380 = auVar145._0_8_;
  uStack_378 = local_380;
  uStack_370 = local_380;
  uStack_368 = local_380;
  auVar145 = vshufps_avx(_local_990,_local_990,0xff);
  local_3a0 = auVar145._0_8_;
  uStack_398 = local_3a0;
  uStack_390 = local_3a0;
  uStack_388 = local_3a0;
  auVar100._0_4_ = aVar2.x * aVar2.x;
  auVar100._4_4_ = aVar2.y * aVar2.y;
  auVar100._8_4_ = aVar2.z * aVar2.z;
  auVar100._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar145 = vshufps_avx(auVar100,auVar100,0xaa);
  uVar93 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
  local_6e0._4_4_ = uVar93;
  local_6e0._0_4_ = uVar93;
  fStack_6d8 = (float)uVar93;
  fStack_6d4 = (float)uVar93;
  fStack_6d0 = (float)uVar93;
  fStack_6cc = (float)uVar93;
  fStack_6c8 = (float)uVar93;
  register0x0000131c = uVar93;
  uVar95 = auVar145._0_8_;
  auVar229._8_8_ = uVar95;
  auVar229._0_8_ = uVar95;
  auVar229._16_8_ = uVar95;
  auVar229._24_8_ = uVar95;
  auVar145 = vfmadd231ps_fma(auVar229,_local_6e0,_local_6e0);
  uVar93 = *(undefined4 *)&(ray->dir).field_0;
  local_5c0._4_4_ = uVar93;
  local_5c0._0_4_ = uVar93;
  fStack_5b8 = (float)uVar93;
  fStack_5b4 = (float)uVar93;
  fStack_5b0 = (float)uVar93;
  fStack_5ac = (float)uVar93;
  fStack_5a8 = (float)uVar93;
  register0x0000121c = uVar93;
  auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),_local_5c0,_local_5c0);
  auVar232 = ZEXT1664(auVar145);
  local_ac4 = 1;
  uVar91 = 0;
  bVar89 = false;
  local_700 = (ray->dir).field_0.m128[2];
  local_240 = local_960._0_4_;
  uStack_23c = local_240;
  uStack_238 = local_240;
  uStack_234 = local_240;
  uStack_230 = local_240;
  uStack_22c = local_240;
  uStack_228 = local_240;
  uStack_224 = local_240;
  local_3c0 = local_980._0_4_;
  uStack_3bc = local_3c0;
  uStack_3b8 = local_3c0;
  uStack_3b4 = local_3c0;
  uStack_3b0 = local_3c0;
  uStack_3ac = local_3c0;
  uStack_3a8 = local_3c0;
  uStack_3a4 = local_3c0;
  local_3e0 = local_970._0_4_;
  uStack_3dc = local_3e0;
  uStack_3d8 = local_3e0;
  uStack_3d4 = local_3e0;
  uStack_3d0 = local_3e0;
  uStack_3cc = local_3e0;
  uStack_3c8 = local_3e0;
  uStack_3c4 = local_3e0;
  local_260 = local_990._0_4_;
  auVar271._4_4_ = uStack_71c;
  auVar271._0_4_ = local_720;
  auVar271._8_4_ = uStack_718;
  auVar271._12_4_ = uStack_714;
  auVar271._16_4_ = uStack_710;
  auVar271._20_4_ = uStack_70c;
  auVar271._24_4_ = uStack_708;
  auVar271._28_4_ = uStack_704;
  local_420 = vandps_avx(ZEXT1632(auVar145),auVar271);
  auVar225 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_220 = ZEXT1632(auVar145);
  fStack_25c = local_260;
  fStack_258 = local_260;
  fStack_254 = local_260;
  fStack_250 = local_260;
  fStack_24c = local_260;
  fStack_248 = local_260;
  fStack_244 = local_260;
  fStack_6fc = local_700;
  fStack_6f8 = local_700;
  fStack_6f4 = local_700;
  fStack_6f0 = local_700;
  fStack_6ec = local_700;
  fStack_6e8 = local_700;
  fStack_6e4 = local_700;
  do {
    auVar199._8_4_ = 0x3f800000;
    auVar199._0_8_ = 0x3f8000003f800000;
    auVar199._12_4_ = 0x3f800000;
    auVar199._16_4_ = 0x3f800000;
    auVar199._20_4_ = 0x3f800000;
    iVar90 = (int)uVar91;
    auVar199._24_4_ = 0x3f800000;
    auVar199._28_4_ = 0x3f800000;
    local_4b0 = auVar225._0_16_;
    auVar145 = vmovshdup_avx(local_4b0);
    auVar145 = vsubps_avx(auVar145,local_4b0);
    local_680._0_4_ = auVar145._0_4_;
    fVar190 = local_680._0_4_ * 0.04761905;
    local_840._0_4_ = auVar225._0_4_;
    local_840._4_4_ = local_840._0_4_;
    local_840._8_4_ = local_840._0_4_;
    local_840._12_4_ = local_840._0_4_;
    local_840._16_4_ = local_840._0_4_;
    local_840._20_4_ = local_840._0_4_;
    local_840._24_4_ = local_840._0_4_;
    local_840._28_4_ = local_840._0_4_;
    local_680._4_4_ = local_680._0_4_;
    local_680._8_4_ = local_680._0_4_;
    local_680._12_4_ = local_680._0_4_;
    local_680._16_4_ = local_680._0_4_;
    local_680._20_4_ = local_680._0_4_;
    local_680._24_4_ = local_680._0_4_;
    local_680._28_4_ = local_680._0_4_;
    auVar145 = vfmadd231ps_fma(local_840,local_680,_DAT_01faff20);
    auVar112 = vsubps_avx(auVar199,ZEXT1632(auVar145));
    fVar223 = auVar145._0_4_;
    fVar279 = auVar145._4_4_;
    fVar280 = auVar145._8_4_;
    fVar281 = auVar145._12_4_;
    fVar94 = auVar112._0_4_;
    fVar226 = auVar112._4_4_;
    fVar233 = auVar112._8_4_;
    fVar234 = auVar112._12_4_;
    fVar235 = auVar112._16_4_;
    fVar236 = auVar112._20_4_;
    fVar237 = auVar112._24_4_;
    auVar225._28_36_ = auVar232._28_36_;
    auVar225._0_28_ =
         ZEXT1628(CONCAT412(fVar281 * fVar281,
                            CONCAT48(fVar280 * fVar280,CONCAT44(fVar279 * fVar279,fVar223 * fVar223)
                                    )));
    fVar238 = fVar223 * 3.0;
    fVar250 = fVar279 * 3.0;
    fVar251 = fVar280 * 3.0;
    fVar252 = fVar281 * 3.0;
    fVar261 = auVar249._28_4_ + -5.0;
    auVar232._0_4_ = fVar94 * fVar94;
    auVar232._4_4_ = fVar226 * fVar226;
    auVar232._8_4_ = fVar233 * fVar233;
    auVar232._12_4_ = fVar234 * fVar234;
    auVar232._16_4_ = fVar235 * fVar235;
    auVar232._20_4_ = fVar236 * fVar236;
    auVar232._28_36_ = auVar264._28_36_;
    auVar232._24_4_ = fVar237 * fVar237;
    auVar278._0_4_ = (auVar232._0_4_ * (fVar94 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._4_4_ = (auVar232._4_4_ * (fVar226 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._8_4_ = (auVar232._8_4_ * (fVar233 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._12_4_ = (auVar232._12_4_ * (fVar234 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._16_4_ = (auVar232._16_4_ * (fVar235 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._20_4_ = (auVar232._20_4_ * (fVar236 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar278._28_36_ = auVar277._28_36_;
    auVar278._24_4_ = (auVar232._24_4_ * (fVar237 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar271 = auVar278._0_32_;
    fVar207 = fVar223 * fVar223 * (float)((uint)fVar94 ^ local_6c0) * 0.5;
    fVar217 = fVar279 * fVar279 * (float)((uint)fVar226 ^ uStack_6bc) * 0.5;
    fVar218 = fVar280 * fVar280 * (float)((uint)fVar233 ^ uStack_6b8) * 0.5;
    fVar219 = fVar281 * fVar281 * (float)((uint)fVar234 ^ uStack_6b4) * 0.5;
    fVar220 = (float)((uint)fVar235 ^ (uint)fStack_6b0) * 0.0 * 0.0 * 0.5;
    fVar221 = (float)((uint)fVar236 ^ (uint)fStack_6ac) * 0.0 * 0.0 * 0.5;
    fVar222 = (float)((uint)fVar237 ^ (uint)fStack_6a8) * 0.0 * 0.0 * 0.5;
    auVar9._4_4_ = fStack_25c * fVar217;
    auVar9._0_4_ = local_260 * fVar207;
    auVar9._8_4_ = fStack_258 * fVar218;
    auVar9._12_4_ = fStack_254 * fVar219;
    auVar9._16_4_ = fStack_250 * fVar220;
    auVar9._20_4_ = fStack_24c * fVar221;
    auVar9._24_4_ = fStack_248 * fVar222;
    auVar9._28_4_ = 0x40000000;
    auVar184._0_4_ = fVar207 * (float)local_360;
    auVar184._4_4_ = fVar217 * local_360._4_4_;
    auVar184._8_4_ = fVar218 * (float)uStack_358;
    auVar184._12_4_ = fVar219 * uStack_358._4_4_;
    auVar184._16_4_ = fVar220 * (float)uStack_350;
    auVar184._20_4_ = fVar221 * uStack_350._4_4_;
    auVar184._24_4_ = fVar222 * (float)uStack_348;
    auVar184._28_4_ = 0;
    auVar264._0_4_ = fVar207 * (float)local_380;
    auVar264._4_4_ = fVar217 * local_380._4_4_;
    auVar264._8_4_ = fVar218 * (float)uStack_378;
    auVar264._12_4_ = fVar219 * uStack_378._4_4_;
    auVar264._16_4_ = fVar220 * (float)uStack_370;
    auVar264._20_4_ = fVar221 * uStack_370._4_4_;
    auVar264._28_36_ = auVar169._28_36_;
    auVar264._24_4_ = fVar222 * (float)uStack_368;
    auVar11._4_4_ = fVar217 * local_3a0._4_4_;
    auVar11._0_4_ = fVar207 * (float)local_3a0;
    auVar11._8_4_ = fVar218 * (float)uStack_398;
    auVar11._12_4_ = fVar219 * uStack_398._4_4_;
    auVar11._16_4_ = fVar220 * (float)uStack_390;
    auVar11._20_4_ = fVar221 * uStack_390._4_4_;
    auVar11._24_4_ = fVar222 * (float)uStack_388;
    auVar11._28_4_ = auVar112._28_4_ ^ uStack_6a4;
    auVar272._4_4_ = uStack_3dc;
    auVar272._0_4_ = local_3e0;
    auVar272._8_4_ = uStack_3d8;
    auVar272._12_4_ = uStack_3d4;
    auVar272._16_4_ = uStack_3d0;
    auVar272._20_4_ = uStack_3cc;
    auVar272._24_4_ = uStack_3c8;
    auVar272._28_4_ = uStack_3c4;
    auVar145 = vfmadd231ps_fma(auVar9,auVar271,auVar272);
    auVar67._8_8_ = uStack_2f8;
    auVar67._0_8_ = local_300;
    auVar67._16_8_ = uStack_2f0;
    auVar67._24_8_ = uStack_2e8;
    auVar107 = vfmadd231ps_fma(auVar184,auVar271,auVar67);
    auVar65._8_8_ = uStack_318;
    auVar65._0_8_ = local_320;
    auVar65._16_8_ = uStack_310;
    auVar65._24_8_ = uStack_308;
    auVar7 = vfmadd231ps_fma(auVar264._0_32_,auVar271,auVar65);
    auVar63._8_8_ = uStack_338;
    auVar63._0_8_ = local_340;
    auVar63._16_8_ = uStack_330;
    auVar63._24_8_ = uStack_328;
    auVar257 = vfmadd231ps_fma(auVar11,auVar271,auVar63);
    auVar12._4_4_ = fVar226 * fVar226 * (float)((uint)fVar279 ^ uStack_6bc) * 0.5;
    auVar12._0_4_ = fVar94 * fVar94 * (float)((uint)fVar223 ^ local_6c0) * 0.5;
    auVar12._8_4_ = fVar233 * fVar233 * (float)((uint)fVar280 ^ uStack_6b8) * 0.5;
    auVar12._12_4_ = fVar234 * fVar234 * (float)((uint)fVar281 ^ uStack_6b4) * 0.5;
    auVar12._16_4_ = fVar235 * fVar235 * fStack_6b0 * 0.5;
    auVar12._20_4_ = fVar236 * fVar236 * fStack_6ac * 0.5;
    auVar12._24_4_ = fVar237 * fVar237 * fStack_6a8 * 0.5;
    auVar12._28_4_ = auVar269._28_4_;
    auVar13._4_4_ = ((fVar250 + -5.0) * fVar279 * fVar279 + 2.0) * 0.5;
    auVar13._0_4_ = ((fVar238 + -5.0) * fVar223 * fVar223 + 2.0) * 0.5;
    auVar13._8_4_ = ((fVar251 + -5.0) * fVar280 * fVar280 + 2.0) * 0.5;
    auVar13._12_4_ = ((fVar252 + -5.0) * fVar281 * fVar281 + 2.0) * 0.5;
    auVar13._16_4_ = 0x3f800000;
    auVar13._20_4_ = 0x3f800000;
    auVar13._24_4_ = 0x3f800000;
    auVar13._28_4_ = auVar277._28_4_ + 2.0;
    auVar61._4_4_ = uStack_3bc;
    auVar61._0_4_ = local_3c0;
    auVar61._8_4_ = uStack_3b8;
    auVar61._12_4_ = uStack_3b4;
    auVar61._16_4_ = uStack_3b0;
    auVar61._20_4_ = uStack_3ac;
    auVar61._24_4_ = uStack_3a8;
    auVar61._28_4_ = uStack_3a4;
    auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar13,auVar61);
    auVar78._8_8_ = uStack_1f8;
    auVar78._0_8_ = local_200;
    auVar78._16_8_ = uStack_1f0;
    auVar78._24_8_ = uStack_1e8;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar13,auVar78);
    auVar71._8_8_ = uStack_2b8;
    auVar71._0_8_ = local_2c0;
    auVar71._16_8_ = uStack_2b0;
    auVar71._24_8_ = uStack_2a8;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar13,auVar71);
    auVar69._8_8_ = uStack_2d8;
    auVar69._0_8_ = local_2e0;
    auVar69._16_8_ = uStack_2d0;
    auVar69._24_8_ = uStack_2c8;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar13,auVar69);
    auVar77._4_4_ = uStack_23c;
    auVar77._0_4_ = local_240;
    auVar77._8_4_ = uStack_238;
    auVar77._12_4_ = uStack_234;
    auVar77._16_4_ = uStack_230;
    auVar77._20_4_ = uStack_22c;
    auVar77._24_4_ = uStack_228;
    auVar77._28_4_ = uStack_224;
    auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar12,auVar77);
    auVar75._8_8_ = uStack_278;
    auVar75._0_8_ = local_280;
    auVar75._16_8_ = uStack_270;
    auVar75._24_8_ = uStack_268;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar12,auVar75);
    local_a20 = ZEXT1632(auVar107);
    auVar79._8_8_ = uStack_1d8;
    auVar79._0_8_ = local_1e0;
    auVar79._16_8_ = uStack_1d0;
    auVar79._24_8_ = uStack_1c8;
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar12,auVar79);
    auVar73._8_8_ = uStack_298;
    auVar73._0_8_ = local_2a0;
    auVar73._16_8_ = uStack_290;
    auVar73._24_8_ = uStack_288;
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar12,auVar73);
    auVar272 = ZEXT1632(auVar7);
    auVar120._4_4_ = (fVar226 + fVar226) * fVar279;
    auVar120._0_4_ = (fVar94 + fVar94) * fVar223;
    auVar120._8_4_ = (fVar233 + fVar233) * fVar280;
    auVar120._12_4_ = (fVar234 + fVar234) * fVar281;
    auVar120._16_4_ = (fVar235 + fVar235) * 0.0;
    auVar120._20_4_ = (fVar236 + fVar236) * 0.0;
    auVar120._24_4_ = (fVar237 + fVar237) * 0.0;
    auVar120._28_4_ = 0;
    auVar271 = vsubps_avx(auVar120,auVar232._0_32_);
    fVar207 = auVar249._28_4_ + 2.0;
    auVar14._4_4_ = (fVar226 + fVar226) * (fVar250 + 2.0);
    auVar14._0_4_ = (fVar94 + fVar94) * (fVar238 + 2.0);
    auVar14._8_4_ = (fVar233 + fVar233) * (fVar251 + 2.0);
    auVar14._12_4_ = (fVar234 + fVar234) * (fVar252 + 2.0);
    auVar14._16_4_ = (fVar235 + fVar235) * 2.0;
    auVar14._20_4_ = (fVar236 + fVar236) * 2.0;
    auVar14._24_4_ = (fVar237 + fVar237) * 2.0;
    auVar14._28_4_ = fVar207;
    auVar255._4_4_ = fVar226 * fVar226 * 3.0;
    auVar255._0_4_ = fVar94 * fVar94 * 3.0;
    auVar255._8_4_ = fVar233 * fVar233 * 3.0;
    auVar255._12_4_ = fVar234 * fVar234 * 3.0;
    auVar255._16_4_ = fVar235 * fVar235 * 3.0;
    auVar255._20_4_ = fVar236 * fVar236 * 3.0;
    auVar255._24_4_ = fVar237 * fVar237 * 3.0;
    auVar255._28_4_ = auVar112._28_4_;
    auVar112 = vsubps_avx(auVar14,auVar255);
    auVar229 = vsubps_avx(auVar225._0_32_,auVar120);
    auVar15._4_4_ = auVar271._4_4_ * 0.5;
    auVar15._0_4_ = auVar271._0_4_ * 0.5;
    auVar15._8_4_ = auVar271._8_4_ * 0.5;
    auVar15._12_4_ = auVar271._12_4_ * 0.5;
    auVar15._16_4_ = auVar271._16_4_ * 0.5;
    auVar15._20_4_ = auVar271._20_4_ * 0.5;
    auVar15._24_4_ = auVar271._24_4_ * 0.5;
    auVar15._28_4_ = fVar207;
    auVar16._28_4_ = fVar261 + 0.0;
    auVar16._0_28_ =
         ZEXT1628(CONCAT412(((fVar281 + fVar281) * (fVar252 + -5.0) + fVar252 * fVar281) * 0.5,
                            CONCAT48(((fVar280 + fVar280) * (fVar251 + -5.0) + fVar251 * fVar280) *
                                     0.5,CONCAT44(((fVar279 + fVar279) * (fVar250 + -5.0) +
                                                  fVar250 * fVar279) * 0.5,
                                                  ((fVar223 + fVar223) * (fVar238 + -5.0) +
                                                  fVar238 * fVar223) * 0.5))));
    auVar17._4_4_ = auVar112._4_4_ * 0.5;
    auVar17._0_4_ = auVar112._0_4_ * 0.5;
    auVar17._8_4_ = auVar112._8_4_ * 0.5;
    auVar17._12_4_ = auVar112._12_4_ * 0.5;
    auVar17._16_4_ = auVar112._16_4_ * 0.5;
    auVar17._20_4_ = auVar112._20_4_ * 0.5;
    fVar94 = auVar112._28_4_;
    auVar17._24_4_ = auVar112._24_4_ * 0.5;
    auVar17._28_4_ = fVar94;
    fVar226 = auVar229._0_4_ * 0.5;
    fVar233 = auVar229._4_4_ * 0.5;
    fVar234 = auVar229._8_4_ * 0.5;
    fVar235 = auVar229._12_4_ * 0.5;
    fVar236 = auVar229._16_4_ * 0.5;
    fVar237 = auVar229._20_4_ * 0.5;
    fVar207 = auVar229._24_4_ * 0.5;
    auVar18._4_4_ = fStack_25c * fVar233;
    auVar18._0_4_ = local_260 * fVar226;
    auVar18._8_4_ = fStack_258 * fVar234;
    auVar18._12_4_ = fStack_254 * fVar235;
    auVar18._16_4_ = fStack_250 * fVar236;
    auVar18._20_4_ = fStack_24c * fVar237;
    auVar18._24_4_ = fStack_248 * fVar207;
    auVar18._28_4_ = fStack_244;
    auVar21._4_4_ = fVar233 * local_360._4_4_;
    auVar21._0_4_ = fVar226 * (float)local_360;
    auVar21._8_4_ = fVar234 * (float)uStack_358;
    auVar21._12_4_ = fVar235 * uStack_358._4_4_;
    auVar21._16_4_ = fVar236 * (float)uStack_350;
    auVar21._20_4_ = fVar237 * uStack_350._4_4_;
    auVar21._24_4_ = fVar207 * (float)uStack_348;
    auVar21._28_4_ = fVar261;
    auVar156._4_4_ = fVar233 * local_380._4_4_;
    auVar156._0_4_ = fVar226 * (float)local_380;
    auVar156._8_4_ = fVar234 * (float)uStack_378;
    auVar156._12_4_ = fVar235 * uStack_378._4_4_;
    auVar156._16_4_ = fVar236 * (float)uStack_370;
    auVar156._20_4_ = fVar237 * uStack_370._4_4_;
    auVar156._24_4_ = fVar207 * (float)uStack_368;
    auVar156._28_4_ = auVar271._28_4_;
    auVar260._4_4_ = fVar233 * local_3a0._4_4_;
    auVar260._0_4_ = fVar226 * (float)local_3a0;
    auVar260._8_4_ = fVar234 * (float)uStack_398;
    auVar260._12_4_ = fVar235 * uStack_398._4_4_;
    auVar260._16_4_ = fVar236 * (float)uStack_390;
    auVar260._20_4_ = fVar237 * uStack_390._4_4_;
    auVar260._24_4_ = fVar207 * (float)uStack_388;
    auVar260._28_4_ = auVar229._28_4_;
    auVar60._4_4_ = uStack_3dc;
    auVar60._0_4_ = local_3e0;
    auVar60._8_4_ = uStack_3d8;
    auVar60._12_4_ = uStack_3d4;
    auVar60._16_4_ = uStack_3d0;
    auVar60._20_4_ = uStack_3cc;
    auVar60._24_4_ = uStack_3c8;
    auVar60._28_4_ = uStack_3c4;
    auVar257 = vfmadd231ps_fma(auVar18,auVar17,auVar60);
    auVar68._8_8_ = uStack_2f8;
    auVar68._0_8_ = local_300;
    auVar68._16_8_ = uStack_2f0;
    auVar68._24_8_ = uStack_2e8;
    auVar8 = vfmadd231ps_fma(auVar21,auVar17,auVar68);
    auVar66._8_8_ = uStack_318;
    auVar66._0_8_ = local_320;
    auVar66._16_8_ = uStack_310;
    auVar66._24_8_ = uStack_308;
    auVar228 = vfmadd231ps_fma(auVar156,auVar17,auVar66);
    auVar64._8_8_ = uStack_338;
    auVar64._0_8_ = local_340;
    auVar64._16_8_ = uStack_330;
    auVar64._24_8_ = uStack_328;
    auVar99 = vfmadd231ps_fma(auVar260,auVar17,auVar64);
    auVar62._4_4_ = uStack_3bc;
    auVar62._0_4_ = local_3c0;
    auVar62._8_4_ = uStack_3b8;
    auVar62._12_4_ = uStack_3b4;
    auVar62._16_4_ = uStack_3b0;
    auVar62._20_4_ = uStack_3ac;
    auVar62._24_4_ = uStack_3a8;
    auVar62._28_4_ = uStack_3a4;
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar16,auVar62);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar16,auVar78);
    auVar72._8_8_ = uStack_2b8;
    auVar72._0_8_ = local_2c0;
    auVar72._16_8_ = uStack_2b0;
    auVar72._24_8_ = uStack_2a8;
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar16,auVar72);
    auVar70._8_8_ = uStack_2d8;
    auVar70._0_8_ = local_2e0;
    auVar70._16_8_ = uStack_2d0;
    auVar70._24_8_ = uStack_2c8;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar16,auVar70);
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar257),auVar15,auVar77);
    auVar76._8_8_ = uStack_278;
    auVar76._0_8_ = local_280;
    auVar76._16_8_ = uStack_270;
    auVar76._24_8_ = uStack_268;
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),auVar15,auVar76);
    auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar15,auVar79);
    auVar74._8_8_ = uStack_298;
    auVar74._0_8_ = local_2a0;
    auVar74._16_8_ = uStack_290;
    auVar74._24_8_ = uStack_288;
    auVar99 = vfmadd231ps_fma(ZEXT1632(auVar99),auVar15,auVar74);
    local_8e0._0_4_ = auVar257._0_4_ * fVar190;
    local_8e0._4_4_ = auVar257._4_4_ * fVar190;
    local_8e0._8_4_ = auVar257._8_4_ * fVar190;
    local_8e0._12_4_ = auVar257._12_4_ * fVar190;
    local_8e0._16_4_ = fVar190 * 0.0;
    local_8e0._20_4_ = fVar190 * 0.0;
    local_8e0._24_4_ = fVar190 * 0.0;
    local_8e0._28_4_ = 0;
    fVar236 = auVar8._0_4_ * fVar190;
    fVar279 = auVar8._4_4_ * fVar190;
    local_9c0._4_4_ = fVar279;
    local_9c0._0_4_ = fVar236;
    fVar280 = auVar8._8_4_ * fVar190;
    local_9c0._8_4_ = fVar280;
    fVar281 = auVar8._12_4_ * fVar190;
    local_9c0._12_4_ = fVar281;
    local_9c0._16_4_ = fVar190 * 0.0;
    local_9c0._20_4_ = fVar190 * 0.0;
    local_9c0._24_4_ = fVar190 * 0.0;
    local_9c0._28_4_ = 0;
    fVar285 = auVar228._0_4_ * fVar190;
    fVar286 = auVar228._4_4_ * fVar190;
    local_9e0._4_4_ = fVar286;
    local_9e0._0_4_ = fVar285;
    fVar287 = auVar228._8_4_ * fVar190;
    local_9e0._8_4_ = fVar287;
    fVar288 = auVar228._12_4_ * fVar190;
    local_9e0._12_4_ = fVar288;
    fVar289 = fVar190 * 0.0;
    local_9e0._16_4_ = fVar289;
    fVar290 = fVar190 * 0.0;
    local_9e0._20_4_ = fVar290;
    fVar291 = fVar190 * 0.0;
    local_9e0._24_4_ = fVar291;
    local_9e0._28_4_ = 0x3f000000;
    fVar226 = fVar190 * auVar99._0_4_;
    fVar233 = fVar190 * auVar99._4_4_;
    auVar284._4_4_ = fVar233;
    auVar284._0_4_ = fVar226;
    fVar234 = fVar190 * auVar99._8_4_;
    auVar284._8_4_ = fVar234;
    fVar235 = fVar190 * auVar99._12_4_;
    auVar284._12_4_ = fVar235;
    auVar284._16_4_ = fVar190 * 0.0;
    auVar284._20_4_ = fVar190 * 0.0;
    auVar284._24_4_ = fVar190 * 0.0;
    auVar284._28_4_ = fVar94;
    local_7e0 = ZEXT1632(auVar145);
    auVar16 = vpermps_avx2(_DAT_01fec480,local_7e0);
    local_8c0 = vpermps_avx2(_DAT_01fec480,local_a20);
    local_660 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar107));
    auVar11 = vsubps_avx(auVar16,ZEXT1632(auVar145));
    auVar12 = vsubps_avx(local_660,ZEXT1632(auVar107));
    auVar156 = ZEXT1632(auVar107);
    fVar237 = auVar12._0_4_;
    fVar207 = auVar12._4_4_;
    auVar6._4_4_ = fVar207 * local_8e0._4_4_;
    auVar6._0_4_ = fVar237 * (float)local_8e0._0_4_;
    fVar217 = auVar12._8_4_;
    auVar6._8_4_ = fVar217 * local_8e0._8_4_;
    fVar218 = auVar12._12_4_;
    auVar6._12_4_ = fVar218 * local_8e0._12_4_;
    fVar219 = auVar12._16_4_;
    auVar6._16_4_ = fVar219 * local_8e0._16_4_;
    fVar220 = auVar12._20_4_;
    auVar6._20_4_ = fVar220 * local_8e0._20_4_;
    fVar221 = auVar12._24_4_;
    auVar6._24_4_ = fVar221 * local_8e0._24_4_;
    auVar6._28_4_ = auVar16._28_4_;
    auVar145 = vfmsub231ps_fma(auVar6,local_9e0,auVar11);
    auVar13 = vsubps_avx(local_8c0,local_a20);
    fVar222 = auVar11._0_4_;
    fVar223 = auVar11._4_4_;
    auVar202._4_4_ = fVar223 * fVar279;
    auVar202._0_4_ = fVar222 * fVar236;
    fVar279 = auVar11._8_4_;
    auVar202._8_4_ = fVar279 * fVar280;
    fVar280 = auVar11._12_4_;
    auVar202._12_4_ = fVar280 * fVar281;
    fVar281 = auVar11._16_4_;
    auVar202._16_4_ = fVar281 * fVar190 * 0.0;
    fVar238 = auVar11._20_4_;
    auVar202._20_4_ = fVar238 * fVar190 * 0.0;
    fVar250 = auVar11._24_4_;
    auVar202._24_4_ = fVar250 * fVar190 * 0.0;
    auVar202._28_4_ = local_8c0._28_4_;
    auVar107 = vfmsub231ps_fma(auVar202,local_8e0,auVar13);
    auVar145 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * auVar107._12_4_,
                                                  CONCAT48(auVar107._8_4_ * auVar107._8_4_,
                                                           CONCAT44(auVar107._4_4_ * auVar107._4_4_,
                                                                    auVar107._0_4_ * auVar107._0_4_)
                                                          ))),ZEXT1632(auVar145),ZEXT1632(auVar145))
    ;
    fVar251 = auVar13._0_4_;
    fVar252 = auVar13._4_4_;
    auVar10._4_4_ = fVar252 * fVar286;
    auVar10._0_4_ = fVar251 * fVar285;
    fVar261 = auVar13._8_4_;
    auVar10._8_4_ = fVar261 * fVar287;
    fVar204 = auVar13._12_4_;
    auVar10._12_4_ = fVar204 * fVar288;
    fVar205 = auVar13._16_4_;
    auVar10._16_4_ = fVar205 * fVar289;
    fVar206 = auVar13._20_4_;
    auVar10._20_4_ = fVar206 * fVar290;
    fVar270 = auVar13._24_4_;
    auVar10._24_4_ = fVar270 * fVar291;
    auVar10._28_4_ = local_660._28_4_;
    auVar257 = vfmsub231ps_fma(auVar10,local_9c0,auVar12);
    auVar185._0_4_ = fVar237 * fVar237;
    auVar185._4_4_ = fVar207 * fVar207;
    auVar185._8_4_ = fVar217 * fVar217;
    auVar185._12_4_ = fVar218 * fVar218;
    auVar185._16_4_ = fVar219 * fVar219;
    auVar185._20_4_ = fVar220 * fVar220;
    auVar185._24_4_ = fVar221 * fVar221;
    auVar185._28_4_ = 0;
    auVar107 = vfmadd231ps_fma(auVar185,auVar13,auVar13);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar11,auVar11);
    auVar112 = vrcpps_avx(ZEXT1632(auVar107));
    auVar257 = vfmadd231ps_fma(ZEXT1632(auVar145),ZEXT1632(auVar257),ZEXT1632(auVar257));
    auVar157._8_4_ = 0x3f800000;
    auVar157._0_8_ = 0x3f8000003f800000;
    auVar157._12_4_ = 0x3f800000;
    auVar157._16_4_ = 0x3f800000;
    auVar157._20_4_ = 0x3f800000;
    auVar157._24_4_ = 0x3f800000;
    auVar157._28_4_ = 0x3f800000;
    auVar145 = vfnmadd213ps_fma(auVar112,ZEXT1632(auVar107),auVar157);
    auVar145 = vfmadd132ps_fma(ZEXT1632(auVar145),auVar112,auVar112);
    local_800 = vpermps_avx2(_DAT_01fec480,local_8e0);
    local_820 = vpermps_avx2(_DAT_01fec480,local_9e0);
    auVar22._4_4_ = fVar207 * local_800._4_4_;
    auVar22._0_4_ = fVar237 * local_800._0_4_;
    auVar22._8_4_ = fVar217 * local_800._8_4_;
    auVar22._12_4_ = fVar218 * local_800._12_4_;
    auVar22._16_4_ = fVar219 * local_800._16_4_;
    auVar22._20_4_ = fVar220 * local_800._20_4_;
    auVar22._24_4_ = fVar221 * local_800._24_4_;
    auVar22._28_4_ = auVar112._28_4_;
    auVar8 = vfmsub231ps_fma(auVar22,local_820,auVar11);
    local_a00 = vpermps_avx2(_DAT_01fec480,local_9c0);
    auVar23._4_4_ = fVar223 * local_a00._4_4_;
    auVar23._0_4_ = fVar222 * local_a00._0_4_;
    auVar23._8_4_ = fVar279 * local_a00._8_4_;
    auVar23._12_4_ = fVar280 * local_a00._12_4_;
    auVar23._16_4_ = fVar281 * local_a00._16_4_;
    auVar23._20_4_ = fVar238 * local_a00._20_4_;
    auVar23._24_4_ = fVar250 * local_a00._24_4_;
    auVar23._28_4_ = 0;
    auVar228 = vfmsub231ps_fma(auVar23,local_800,auVar13);
    auVar8 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar228._12_4_ * auVar228._12_4_,
                                                CONCAT48(auVar228._8_4_ * auVar228._8_4_,
                                                         CONCAT44(auVar228._4_4_ * auVar228._4_4_,
                                                                  auVar228._0_4_ * auVar228._0_4_)))
                                     ),ZEXT1632(auVar8),ZEXT1632(auVar8));
    auVar242._0_4_ = fVar251 * local_820._0_4_;
    auVar242._4_4_ = fVar252 * local_820._4_4_;
    auVar242._8_4_ = fVar261 * local_820._8_4_;
    auVar242._12_4_ = fVar204 * local_820._12_4_;
    auVar242._16_4_ = fVar205 * local_820._16_4_;
    auVar242._20_4_ = fVar206 * local_820._20_4_;
    auVar242._24_4_ = fVar270 * local_820._24_4_;
    auVar242._28_4_ = 0;
    auVar228 = vfmsub231ps_fma(auVar242,local_a00,auVar12);
    auVar8 = vfmadd231ps_fma(ZEXT1632(auVar8),ZEXT1632(auVar228),ZEXT1632(auVar228));
    auVar112 = vmaxps_avx(ZEXT1632(CONCAT412(auVar257._12_4_ * auVar145._12_4_,
                                             CONCAT48(auVar257._8_4_ * auVar145._8_4_,
                                                      CONCAT44(auVar257._4_4_ * auVar145._4_4_,
                                                               auVar257._0_4_ * auVar145._0_4_)))),
                          ZEXT1632(CONCAT412(auVar8._12_4_ * auVar145._12_4_,
                                             CONCAT48(auVar8._8_4_ * auVar145._8_4_,
                                                      CONCAT44(auVar8._4_4_ * auVar145._4_4_,
                                                               auVar8._0_4_ * auVar145._0_4_)))));
    auVar224._0_4_ = auVar7._0_4_ + fVar226;
    auVar224._4_4_ = auVar7._4_4_ + fVar233;
    auVar224._8_4_ = auVar7._8_4_ + fVar234;
    auVar224._12_4_ = auVar7._12_4_ + fVar235;
    auVar224._16_4_ = fVar190 * 0.0 + 0.0;
    auVar224._20_4_ = fVar190 * 0.0 + 0.0;
    auVar224._24_4_ = fVar190 * 0.0 + 0.0;
    auVar224._28_4_ = fVar94 + 0.0;
    auStack_690 = auVar224._16_16_;
    auVar271 = vsubps_avx(auVar272,auVar284);
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar271);
    auVar18 = vpermps_avx2(_DAT_01fec480,auVar272);
    auVar271 = vmaxps_avx(auVar272,auVar224);
    auVar229 = vmaxps_avx(auVar17,auVar18);
    auVar9 = vrsqrtps_avx(ZEXT1632(auVar107));
    auVar271 = vmaxps_avx(auVar271,auVar229);
    fVar190 = auVar9._0_4_;
    fVar94 = auVar9._4_4_;
    fVar226 = auVar9._8_4_;
    fVar233 = auVar9._12_4_;
    fVar234 = auVar9._16_4_;
    fVar235 = auVar9._20_4_;
    fVar236 = auVar9._24_4_;
    auVar254._0_4_ = fVar190 * fVar190 * fVar190 * auVar107._0_4_ * -0.5;
    auVar254._4_4_ = fVar94 * fVar94 * fVar94 * auVar107._4_4_ * -0.5;
    auVar254._8_4_ = fVar226 * fVar226 * fVar226 * auVar107._8_4_ * -0.5;
    auVar254._12_4_ = fVar233 * fVar233 * fVar233 * auVar107._12_4_ * -0.5;
    auVar254._16_4_ = fVar234 * fVar234 * fVar234 * -0.0;
    auVar254._20_4_ = fVar235 * fVar235 * fVar235 * -0.0;
    auVar254._24_4_ = fVar236 * fVar236 * fVar236 * -0.0;
    auVar254._28_4_ = 0;
    auVar113._8_4_ = 0x3fc00000;
    auVar113._0_8_ = 0x3fc000003fc00000;
    auVar113._12_4_ = 0x3fc00000;
    auVar113._16_4_ = 0x3fc00000;
    auVar113._20_4_ = 0x3fc00000;
    auVar113._24_4_ = 0x3fc00000;
    auVar113._28_4_ = 0x3fc00000;
    auVar145 = vfmadd231ps_fma(auVar254,auVar113,auVar9);
    fVar94 = auVar145._0_4_;
    fVar226 = auVar145._4_4_;
    auVar24._4_4_ = fVar252 * fVar226;
    auVar24._0_4_ = fVar251 * fVar94;
    fVar234 = auVar145._8_4_;
    auVar24._8_4_ = fVar261 * fVar234;
    fVar236 = auVar145._12_4_;
    auVar24._12_4_ = fVar204 * fVar236;
    auVar24._16_4_ = fVar205 * 0.0;
    auVar24._20_4_ = fVar206 * 0.0;
    auVar24._24_4_ = fVar270 * 0.0;
    auVar24._28_4_ = 0;
    auVar25._4_4_ = fStack_6fc * fVar207 * fVar226;
    auVar25._0_4_ = local_700 * fVar237 * fVar94;
    auVar25._8_4_ = fStack_6f8 * fVar217 * fVar234;
    auVar25._12_4_ = fStack_6f4 * fVar218 * fVar236;
    auVar25._16_4_ = fStack_6f0 * fVar219 * 0.0;
    auVar25._20_4_ = fStack_6ec * fVar220 * 0.0;
    auVar25._24_4_ = fStack_6e8 * fVar221 * 0.0;
    auVar25._28_4_ = auVar12._28_4_;
    auVar145 = vfmadd231ps_fma(auVar25,auVar24,_local_6e0);
    auVar229 = vsubps_avx(ZEXT832(0) << 0x20,auVar156);
    fVar251 = auVar229._0_4_;
    fVar252 = auVar229._4_4_;
    auVar26._4_4_ = fVar252 * fVar207 * fVar226;
    auVar26._0_4_ = fVar251 * fVar237 * fVar94;
    fVar261 = auVar229._8_4_;
    auVar26._8_4_ = fVar261 * fVar217 * fVar234;
    fVar204 = auVar229._12_4_;
    auVar26._12_4_ = fVar204 * fVar218 * fVar236;
    fVar205 = auVar229._16_4_;
    auVar26._16_4_ = fVar205 * fVar219 * 0.0;
    fVar206 = auVar229._20_4_;
    auVar26._20_4_ = fVar206 * fVar220 * 0.0;
    fVar270 = auVar229._24_4_;
    auVar26._24_4_ = fVar270 * fVar221 * 0.0;
    auVar26._28_4_ = 0;
    auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_a20);
    auVar107 = vfmadd231ps_fma(auVar26,auVar9,auVar24);
    auVar27._4_4_ = fVar223 * fVar226;
    auVar27._0_4_ = fVar222 * fVar94;
    auVar27._8_4_ = fVar279 * fVar234;
    auVar27._12_4_ = fVar280 * fVar236;
    auVar27._16_4_ = fVar281 * 0.0;
    auVar27._20_4_ = fVar238 * 0.0;
    auVar27._24_4_ = fVar250 * 0.0;
    auVar27._28_4_ = 0;
    auVar145 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar27,_local_5c0);
    auVar120 = vsubps_avx(ZEXT832(0) << 0x20,local_7e0);
    auVar264 = ZEXT3264(auVar120);
    auVar107 = vfmadd231ps_fma(ZEXT1632(auVar107),auVar120,auVar27);
    auVar28._4_4_ = fStack_6fc * fVar252;
    auVar28._0_4_ = local_700 * fVar251;
    auVar28._8_4_ = fStack_6f8 * fVar261;
    auVar28._12_4_ = fStack_6f4 * fVar204;
    auVar28._16_4_ = fStack_6f0 * fVar205;
    auVar28._20_4_ = fStack_6ec * fVar206;
    auVar28._24_4_ = fStack_6e8 * fVar270;
    auVar28._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar28,_local_6e0,auVar9);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),_local_5c0,auVar120);
    fVar190 = auVar107._0_4_;
    fVar219 = auVar145._0_4_;
    fVar233 = auVar107._4_4_;
    fVar220 = auVar145._4_4_;
    fVar235 = auVar107._8_4_;
    fVar221 = auVar145._8_4_;
    fVar237 = auVar107._12_4_;
    fVar222 = auVar145._12_4_;
    auVar14 = vsubps_avx(ZEXT1632(auVar7),
                         ZEXT1632(CONCAT412(fVar222 * fVar237,
                                            CONCAT48(fVar221 * fVar235,
                                                     CONCAT44(fVar220 * fVar233,fVar219 * fVar190)))
                                 ));
    auVar29._4_4_ = fVar252 * fVar252;
    auVar29._0_4_ = fVar251 * fVar251;
    auVar29._8_4_ = fVar261 * fVar261;
    auVar29._12_4_ = fVar204 * fVar204;
    auVar29._16_4_ = fVar205 * fVar205;
    auVar29._20_4_ = fVar206 * fVar206;
    auVar29._24_4_ = fVar270 * fVar270;
    auVar29._28_4_ = 0;
    auVar7 = vfmadd231ps_fma(auVar29,auVar9,auVar9);
    auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),auVar120,auVar120);
    auVar30._28_4_ = fStack_6e4;
    auVar30._0_28_ =
         ZEXT1628(CONCAT412(fVar237 * fVar237,
                            CONCAT48(fVar235 * fVar235,CONCAT44(fVar233 * fVar233,fVar190 * fVar190)
                                    )));
    auVar255 = vsubps_avx(ZEXT1632(auVar7),auVar30);
    auVar229 = vsqrtps_avx(auVar112);
    fVar190 = (auVar229._0_4_ + auVar271._0_4_) * 1.0000002;
    fVar233 = (auVar229._4_4_ + auVar271._4_4_) * 1.0000002;
    fVar235 = (auVar229._8_4_ + auVar271._8_4_) * 1.0000002;
    fVar237 = (auVar229._12_4_ + auVar271._12_4_) * 1.0000002;
    fVar207 = (auVar229._16_4_ + auVar271._16_4_) * 1.0000002;
    fVar217 = (auVar229._20_4_ + auVar271._20_4_) * 1.0000002;
    fVar218 = (auVar229._24_4_ + auVar271._24_4_) * 1.0000002;
    auVar31._4_4_ = fVar233 * fVar233;
    auVar31._0_4_ = fVar190 * fVar190;
    auVar31._8_4_ = fVar235 * fVar235;
    auVar31._12_4_ = fVar237 * fVar237;
    auVar31._16_4_ = fVar207 * fVar207;
    auVar31._20_4_ = fVar217 * fVar217;
    auVar31._24_4_ = fVar218 * fVar218;
    auVar31._28_4_ = auVar229._28_4_ + auVar271._28_4_;
    local_900._0_4_ = auVar14._0_4_ + auVar14._0_4_;
    local_900._4_4_ = auVar14._4_4_ + auVar14._4_4_;
    local_900._8_4_ = auVar14._8_4_ + auVar14._8_4_;
    local_900._12_4_ = auVar14._12_4_ + auVar14._12_4_;
    local_900._16_4_ = auVar14._16_4_ + auVar14._16_4_;
    local_900._20_4_ = auVar14._20_4_ + auVar14._20_4_;
    local_900._24_4_ = auVar14._24_4_ + auVar14._24_4_;
    fVar190 = auVar14._28_4_;
    local_900._28_4_ = fVar190 + fVar190;
    auVar271 = vsubps_avx(auVar255,auVar31);
    auVar260 = ZEXT1632(auVar145);
    auVar21 = ZEXT1632(CONCAT412(fVar222 * fVar222,
                                 CONCAT48(fVar221 * fVar221,
                                          CONCAT44(fVar220 * fVar220,fVar219 * fVar219))));
    auVar232 = ZEXT3264(local_220);
    auVar14 = vsubps_avx(local_220,auVar21);
    auVar32._4_4_ = local_900._4_4_ * local_900._4_4_;
    auVar32._0_4_ = local_900._0_4_ * local_900._0_4_;
    auVar32._8_4_ = local_900._8_4_ * local_900._8_4_;
    auVar32._12_4_ = local_900._12_4_ * local_900._12_4_;
    auVar32._16_4_ = local_900._16_4_ * local_900._16_4_;
    auVar32._20_4_ = local_900._20_4_ * local_900._20_4_;
    auVar32._24_4_ = local_900._24_4_ * local_900._24_4_;
    auVar32._28_4_ = local_6e0._28_4_;
    fVar233 = auVar14._0_4_;
    fVar235 = auVar14._4_4_;
    fVar237 = auVar14._8_4_;
    fVar207 = auVar14._12_4_;
    fVar217 = auVar14._16_4_;
    fVar218 = auVar14._20_4_;
    fVar219 = auVar14._24_4_;
    auVar33._4_4_ = auVar271._4_4_ * fVar235 * 4.0;
    auVar33._0_4_ = auVar271._0_4_ * fVar233 * 4.0;
    auVar33._8_4_ = auVar271._8_4_ * fVar237 * 4.0;
    auVar33._12_4_ = auVar271._12_4_ * fVar207 * 4.0;
    auVar33._16_4_ = auVar271._16_4_ * fVar217 * 4.0;
    auVar33._20_4_ = auVar271._20_4_ * fVar218 * 4.0;
    auVar33._24_4_ = auVar271._24_4_ * fVar219 * 4.0;
    auVar33._28_4_ = fVar190;
    auVar15 = vsubps_avx(auVar32,auVar33);
    auVar112 = vcmpps_avx(auVar15,ZEXT432(0) << 0x20,5);
    auVar284 = ZEXT1632(auVar107);
    fVar190 = auVar14._28_4_;
    if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0x7f,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar112 >> 0xbf,0) == '\0') &&
        (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar112[0x1f])
    {
      auVar186._8_4_ = 0x7f800000;
      auVar186._0_8_ = 0x7f8000007f800000;
      auVar186._12_4_ = 0x7f800000;
      auVar186._16_4_ = 0x7f800000;
      auVar186._20_4_ = 0x7f800000;
      auVar186._24_4_ = 0x7f800000;
      auVar186._28_4_ = 0x7f800000;
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar277 = ZEXT3264(CONCAT428(fStack_6e4,
                                    CONCAT424(fStack_6e8,
                                              CONCAT420(fStack_6ec,
                                                        CONCAT416(fStack_6f0,
                                                                  CONCAT412(fStack_6f4,
                                                                            CONCAT48(fStack_6f8,
                                                                                     CONCAT44(
                                                  fStack_6fc,local_700))))))));
    }
    else {
      auVar10 = vsqrtps_avx(auVar15);
      auVar265._0_4_ = fVar233 + fVar233;
      auVar265._4_4_ = fVar235 + fVar235;
      auVar265._8_4_ = fVar237 + fVar237;
      auVar265._12_4_ = fVar207 + fVar207;
      auVar265._16_4_ = fVar217 + fVar217;
      auVar265._20_4_ = fVar218 + fVar218;
      auVar265._24_4_ = fVar219 + fVar219;
      auVar265._28_4_ = fVar190 + fVar190;
      auVar202 = vrcpps_avx(auVar265);
      auVar6 = vcmpps_avx(auVar15,ZEXT432(0) << 0x20,5);
      auVar115._8_4_ = 0x3f800000;
      auVar115._0_8_ = 0x3f8000003f800000;
      auVar115._12_4_ = 0x3f800000;
      auVar115._16_4_ = 0x3f800000;
      auVar115._20_4_ = 0x3f800000;
      auVar115._24_4_ = 0x3f800000;
      auVar115._28_4_ = 0x3f800000;
      auVar145 = vfnmadd213ps_fma(auVar265,auVar202,auVar115);
      auVar145 = vfmadd132ps_fma(ZEXT1632(auVar145),auVar202,auVar202);
      auVar187._0_4_ = (uint)local_900._0_4_ ^ local_6c0;
      auVar187._4_4_ = (uint)local_900._4_4_ ^ uStack_6bc;
      auVar187._8_4_ = (uint)local_900._8_4_ ^ uStack_6b8;
      auVar187._12_4_ = (uint)local_900._12_4_ ^ uStack_6b4;
      auVar187._16_4_ = (uint)local_900._16_4_ ^ (uint)fStack_6b0;
      auVar187._20_4_ = (uint)local_900._20_4_ ^ (uint)fStack_6ac;
      auVar187._24_4_ = (uint)local_900._24_4_ ^ (uint)fStack_6a8;
      auVar187._28_4_ = (uint)local_900._28_4_ ^ uStack_6a4;
      auVar15 = vsubps_avx(auVar187,auVar10);
      auVar34._4_4_ = auVar145._4_4_ * auVar15._4_4_;
      auVar34._0_4_ = auVar145._0_4_ * auVar15._0_4_;
      auVar34._8_4_ = auVar145._8_4_ * auVar15._8_4_;
      auVar34._12_4_ = auVar145._12_4_ * auVar15._12_4_;
      auVar34._16_4_ = auVar15._16_4_ * 0.0;
      auVar34._20_4_ = auVar15._20_4_ * 0.0;
      auVar34._24_4_ = auVar15._24_4_ * 0.0;
      auVar34._28_4_ = auVar15._28_4_;
      auVar15 = vsubps_avx(auVar10,local_900);
      auVar35._4_4_ = auVar145._4_4_ * auVar15._4_4_;
      auVar35._0_4_ = auVar145._0_4_ * auVar15._0_4_;
      auVar35._8_4_ = auVar145._8_4_ * auVar15._8_4_;
      auVar35._12_4_ = auVar145._12_4_ * auVar15._12_4_;
      auVar35._16_4_ = auVar15._16_4_ * 0.0;
      auVar35._20_4_ = auVar15._20_4_ * 0.0;
      auVar35._24_4_ = auVar15._24_4_ * 0.0;
      auVar35._28_4_ = auVar15._28_4_;
      auVar145 = vfmadd213ps_fma(auVar260,auVar34,auVar284);
      local_580 = fVar94 * auVar145._0_4_;
      fStack_57c = fVar226 * auVar145._4_4_;
      fStack_578 = fVar234 * auVar145._8_4_;
      fStack_574 = fVar236 * auVar145._12_4_;
      fStack_570 = 0.0;
      fStack_56c = 0.0;
      fStack_568 = 0.0;
      fStack_564 = 1.0;
      auVar54._4_4_ = uStack_71c;
      auVar54._0_4_ = local_720;
      auVar54._8_4_ = uStack_718;
      auVar54._12_4_ = uStack_714;
      auVar54._16_4_ = uStack_710;
      auVar54._20_4_ = uStack_70c;
      auVar54._24_4_ = uStack_708;
      auVar54._28_4_ = uStack_704;
      auVar15 = vandps_avx(auVar54,auVar21);
      auVar15 = vmaxps_avx(local_420,auVar15);
      auVar36._4_4_ = auVar15._4_4_ * 1.9073486e-06;
      auVar36._0_4_ = auVar15._0_4_ * 1.9073486e-06;
      auVar36._8_4_ = auVar15._8_4_ * 1.9073486e-06;
      auVar36._12_4_ = auVar15._12_4_ * 1.9073486e-06;
      auVar36._16_4_ = auVar15._16_4_ * 1.9073486e-06;
      auVar36._20_4_ = auVar15._20_4_ * 1.9073486e-06;
      auVar36._24_4_ = auVar15._24_4_ * 1.9073486e-06;
      auVar36._28_4_ = auVar15._28_4_;
      auVar15 = vandps_avx(auVar14,auVar54);
      auVar15 = vcmpps_avx(auVar15,auVar36,1);
      auVar232 = ZEXT3264(auVar15);
      auVar145 = vfmadd213ps_fma(auVar260,auVar35,auVar284);
      auVar116._8_4_ = 0x7f800000;
      auVar116._0_8_ = 0x7f8000007f800000;
      auVar116._12_4_ = 0x7f800000;
      auVar116._16_4_ = 0x7f800000;
      auVar116._20_4_ = 0x7f800000;
      auVar116._24_4_ = 0x7f800000;
      auVar116._28_4_ = 0x7f800000;
      auVar186 = vblendvps_avx(auVar116,auVar34,auVar6);
      _local_5a0 = ZEXT1628(CONCAT412(fVar236 * auVar145._12_4_,
                                      CONCAT48(fVar234 * auVar145._8_4_,
                                               CONCAT44(fVar226 * auVar145._4_4_,
                                                        fVar94 * auVar145._0_4_))));
      uStack_584 = 0x7f800000;
      auVar117._8_4_ = 0xff800000;
      auVar117._0_8_ = 0xff800000ff800000;
      auVar117._12_4_ = 0xff800000;
      auVar117._16_4_ = 0xff800000;
      auVar117._20_4_ = 0xff800000;
      auVar117._24_4_ = 0xff800000;
      auVar117._28_4_ = 0xff800000;
      auVar114 = vblendvps_avx(auVar117,auVar35,auVar6);
      auVar202 = auVar6 & auVar15;
      local_620 = auVar255;
      if ((((((((auVar202 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar202 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar202 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar202 >> 0x7f,0) == '\0') &&
            (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar202 >> 0xbf,0) == '\0') &&
          (auVar202 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar202[0x1f]) {
        auVar277 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
      else {
        auVar112 = vandps_avx(auVar15,auVar6);
        auVar15 = vcmpps_avx(auVar271,ZEXT832(0) << 0x20,2);
        auVar168._8_4_ = 0xff800000;
        auVar168._0_8_ = 0xff800000ff800000;
        auVar168._12_4_ = 0xff800000;
        auVar168._16_4_ = 0xff800000;
        auVar168._20_4_ = 0xff800000;
        auVar168._24_4_ = 0xff800000;
        auVar168._28_4_ = 0xff800000;
        auVar127._8_4_ = 0x7f800000;
        auVar127._0_8_ = 0x7f8000007f800000;
        auVar127._12_4_ = 0x7f800000;
        auVar127._16_4_ = 0x7f800000;
        auVar127._20_4_ = 0x7f800000;
        auVar127._24_4_ = 0x7f800000;
        auVar127._28_4_ = 0x7f800000;
        auVar271 = vblendvps_avx(auVar127,auVar168,auVar15);
        auVar145 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
        auVar202 = vpmovsxwd_avx2(auVar145);
        auVar232 = ZEXT3264(auVar202);
        auVar186 = vblendvps_avx(auVar186,auVar271,auVar202);
        auVar271 = vblendvps_avx(auVar168,auVar127,auVar15);
        auVar114 = vblendvps_avx(auVar114,auVar271,auVar202);
        auVar203._0_8_ = auVar112._0_8_ ^ 0xffffffffffffffff;
        auVar203._8_4_ = auVar112._8_4_ ^ 0xffffffff;
        auVar203._12_4_ = auVar112._12_4_ ^ 0xffffffff;
        auVar203._16_4_ = auVar112._16_4_ ^ 0xffffffff;
        auVar203._20_4_ = auVar112._20_4_ ^ 0xffffffff;
        auVar203._24_4_ = auVar112._24_4_ ^ 0xffffffff;
        auVar203._28_4_ = auVar112._28_4_ ^ 0xffffffff;
        auVar112 = vorps_avx(auVar15,auVar203);
        auVar112 = vandps_avx(auVar6,auVar112);
        auVar277 = ZEXT3264(CONCAT428(fStack_6e4,
                                      CONCAT424(fStack_6e8,
                                                CONCAT420(fStack_6ec,
                                                          CONCAT416(fStack_6f0,
                                                                    CONCAT412(fStack_6f4,
                                                                              CONCAT48(fStack_6f8,
                                                                                       CONCAT44(
                                                  fStack_6fc,local_700))))))));
      }
    }
    auVar249 = ZEXT3264(_local_6e0);
    auVar269 = ZEXT3264(local_400);
    auVar271 = local_400 & auVar112;
    fVar220 = (float)local_a40._0_4_;
    fVar221 = (float)local_a40._4_4_;
    fVar222 = fStack_a38;
    fVar223 = fStack_a34;
    fVar279 = fStack_a30;
    fVar280 = fStack_a2c;
    fVar281 = fStack_a28;
    fVar238 = fStack_a24;
    if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar271 >> 0x7f,0) != '\0') ||
          (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar271 >> 0xbf,0) != '\0') ||
        (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar271[0x1f] < '\0') {
      fVar250 = (ray->org).field_0.m128[3] - (float)local_7c0._0_4_;
      auVar200._4_4_ = fVar250;
      auVar200._0_4_ = fVar250;
      auVar200._8_4_ = fVar250;
      auVar200._12_4_ = fVar250;
      auVar200._16_4_ = fVar250;
      auVar200._20_4_ = fVar250;
      auVar200._24_4_ = fVar250;
      auVar200._28_4_ = fVar250;
      auVar15 = vmaxps_avx(auVar200,auVar186);
      fVar250 = ray->tfar - (float)local_7c0._0_4_;
      auVar201._4_4_ = fVar250;
      auVar201._0_4_ = fVar250;
      auVar201._8_4_ = fVar250;
      auVar201._12_4_ = fVar250;
      auVar201._16_4_ = fVar250;
      auVar201._20_4_ = fVar250;
      auVar201._24_4_ = fVar250;
      auVar201._28_4_ = fVar250;
      auVar6 = vminps_avx(auVar201,auVar114);
      auVar269._0_4_ = fVar251 * fVar285;
      auVar269._4_4_ = fVar252 * fVar286;
      auVar269._8_4_ = fVar261 * fVar287;
      auVar269._12_4_ = fVar204 * fVar288;
      auVar269._16_4_ = fVar205 * fVar289;
      auVar269._20_4_ = fVar206 * fVar290;
      auVar269._28_36_ = auVar232._28_36_;
      auVar269._24_4_ = fVar270 * fVar291;
      auVar145 = vfmadd213ps_fma(auVar9,local_9c0,auVar269._0_32_);
      auVar107 = vfmadd213ps_fma(auVar120,local_8e0,ZEXT1632(auVar145));
      auVar37._4_4_ = auVar277._4_4_ * fVar286;
      auVar37._0_4_ = auVar277._0_4_ * fVar285;
      auVar37._8_4_ = auVar277._8_4_ * fVar287;
      auVar37._12_4_ = auVar277._12_4_ * fVar288;
      auVar37._16_4_ = auVar277._16_4_ * fVar289;
      auVar37._20_4_ = auVar277._20_4_ * fVar290;
      auVar37._24_4_ = auVar277._24_4_ * fVar291;
      auVar37._28_4_ = auVar232._28_4_;
      auVar145 = vfmadd231ps_fma(auVar37,_local_6e0,local_9c0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar145),local_8e0,_local_5c0);
      auVar55._4_4_ = uStack_71c;
      auVar55._0_4_ = local_720;
      auVar55._8_4_ = uStack_718;
      auVar55._12_4_ = uStack_714;
      auVar55._16_4_ = uStack_710;
      auVar55._20_4_ = uStack_70c;
      auVar55._24_4_ = uStack_708;
      auVar55._28_4_ = uStack_704;
      auVar271 = vandps_avx(auVar55,ZEXT1632(auVar7));
      auVar118._8_4_ = 0x219392ef;
      auVar118._0_8_ = 0x219392ef219392ef;
      auVar118._12_4_ = 0x219392ef;
      auVar118._16_4_ = 0x219392ef;
      auVar118._20_4_ = 0x219392ef;
      auVar118._24_4_ = 0x219392ef;
      auVar118._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar271,auVar118,1);
      auVar271 = vrcpps_avx(ZEXT1632(auVar7));
      auVar273._8_4_ = 0x3f800000;
      auVar273._0_8_ = 0x3f8000003f800000;
      auVar273._12_4_ = 0x3f800000;
      auVar273._16_4_ = 0x3f800000;
      auVar273._20_4_ = 0x3f800000;
      auVar273._24_4_ = 0x3f800000;
      auVar273._28_4_ = 0x3f800000;
      auVar202 = ZEXT1632(auVar7);
      auVar145 = vfnmadd213ps_fma(auVar271,auVar202,auVar273);
      auVar145 = vfmadd132ps_fma(ZEXT1632(auVar145),auVar271,auVar271);
      auVar274._0_4_ = auVar7._0_4_ ^ local_6c0;
      auVar274._4_4_ = auVar7._4_4_ ^ uStack_6bc;
      auVar274._8_4_ = auVar7._8_4_ ^ uStack_6b8;
      auVar274._12_4_ = auVar7._12_4_ ^ uStack_6b4;
      auVar274._16_4_ = fStack_6b0;
      auVar274._20_4_ = fStack_6ac;
      auVar274._24_4_ = fStack_6a8;
      auVar274._28_4_ = uStack_6a4;
      auVar38._4_4_ = auVar145._4_4_ * (float)(auVar107._4_4_ ^ uStack_6bc);
      auVar38._0_4_ = auVar145._0_4_ * (float)(auVar107._0_4_ ^ local_6c0);
      auVar38._8_4_ = auVar145._8_4_ * (float)(auVar107._8_4_ ^ uStack_6b8);
      auVar38._12_4_ = auVar145._12_4_ * (float)(auVar107._12_4_ ^ uStack_6b4);
      auVar38._16_4_ = fStack_6b0 * 0.0;
      auVar38._20_4_ = fStack_6ac * 0.0;
      auVar38._24_4_ = fStack_6a8 * 0.0;
      auVar38._28_4_ = uStack_6a4;
      auVar271 = vcmpps_avx(auVar202,auVar274,1);
      auVar271 = vorps_avx(auVar9,auVar271);
      auVar266._8_4_ = 0xff800000;
      auVar266._0_8_ = 0xff800000ff800000;
      auVar266._12_4_ = 0xff800000;
      auVar266._16_4_ = 0xff800000;
      auVar266._20_4_ = 0xff800000;
      auVar266._24_4_ = 0xff800000;
      auVar266._28_4_ = 0xff800000;
      auVar271 = vblendvps_avx(auVar38,auVar266,auVar271);
      auVar120 = vmaxps_avx(auVar15,auVar271);
      auVar271 = vcmpps_avx(auVar202,auVar274,6);
      auVar271 = vorps_avx(auVar9,auVar271);
      auVar275._8_4_ = 0x7f800000;
      auVar275._0_8_ = 0x7f8000007f800000;
      auVar275._12_4_ = 0x7f800000;
      auVar275._16_4_ = 0x7f800000;
      auVar275._20_4_ = 0x7f800000;
      auVar275._24_4_ = 0x7f800000;
      auVar275._28_4_ = 0x7f800000;
      auVar277 = ZEXT3264(auVar275);
      auVar271 = vblendvps_avx(auVar38,auVar275,auVar271);
      auVar15 = vminps_avx(auVar6,auVar271);
      fVar250 = (float)(local_6c0 ^ (uint)local_820._0_4_);
      fVar251 = (float)(uStack_6bc ^ (uint)local_820._4_4_);
      fVar252 = (float)(uStack_6b8 ^ (uint)local_820._8_4_);
      fVar261 = (float)(uStack_6b4 ^ (uint)local_820._12_4_);
      fVar204 = (float)((uint)fStack_6b0 ^ (uint)local_820._16_4_);
      fVar205 = (float)((uint)fStack_6ac ^ (uint)local_820._20_4_);
      fVar206 = (float)((uint)fStack_6a8 ^ (uint)local_820._24_4_);
      auVar230._0_4_ = local_6c0 ^ (uint)local_a00._0_4_;
      auVar230._4_4_ = uStack_6bc ^ (uint)local_a00._4_4_;
      auVar230._8_4_ = uStack_6b8 ^ (uint)local_a00._8_4_;
      auVar230._12_4_ = uStack_6b4 ^ (uint)local_a00._12_4_;
      auVar230._16_4_ = (uint)fStack_6b0 ^ (uint)local_a00._16_4_;
      auVar230._20_4_ = (uint)fStack_6ac ^ (uint)local_a00._20_4_;
      auVar230._24_4_ = (uint)fStack_6a8 ^ (uint)local_a00._24_4_;
      auVar230._28_4_ = uStack_6a4 ^ local_a00._28_4_;
      auVar271 = vsubps_avx(ZEXT832(0) << 0x20,local_8c0);
      auVar9 = vsubps_avx(ZEXT832(0) << 0x20,local_660);
      auVar39._4_4_ = auVar9._4_4_ * fVar251;
      auVar39._0_4_ = auVar9._0_4_ * fVar250;
      auVar39._8_4_ = auVar9._8_4_ * fVar252;
      auVar39._12_4_ = auVar9._12_4_ * fVar261;
      auVar39._16_4_ = auVar9._16_4_ * fVar204;
      auVar39._20_4_ = auVar9._20_4_ * fVar205;
      auVar39._24_4_ = auVar9._24_4_ * fVar206;
      auVar39._28_4_ = auVar9._28_4_;
      auVar145 = vfmadd231ps_fma(auVar39,auVar230,auVar271);
      auVar243._0_4_ = local_6c0 ^ (uint)local_800._0_4_;
      auVar243._4_4_ = uStack_6bc ^ (uint)local_800._4_4_;
      auVar243._8_4_ = uStack_6b8 ^ (uint)local_800._8_4_;
      auVar243._12_4_ = uStack_6b4 ^ (uint)local_800._12_4_;
      auVar243._16_4_ = (uint)fStack_6b0 ^ (uint)local_800._16_4_;
      auVar243._20_4_ = (uint)fStack_6ac ^ (uint)local_800._20_4_;
      auVar243._24_4_ = (uint)fStack_6a8 ^ (uint)local_800._24_4_;
      auVar243._28_4_ = uStack_6a4 ^ local_800._28_4_;
      auVar271 = vsubps_avx(ZEXT832(0) << 0x20,auVar16);
      auVar107 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar243,auVar271);
      auVar40._4_4_ = fVar251 * fStack_6fc;
      auVar40._0_4_ = fVar250 * local_700;
      auVar40._8_4_ = fVar252 * fStack_6f8;
      auVar40._12_4_ = fVar261 * fStack_6f4;
      auVar40._16_4_ = fVar204 * fStack_6f0;
      auVar40._20_4_ = fVar205 * fStack_6ec;
      auVar40._24_4_ = fVar206 * fStack_6e8;
      auVar40._28_4_ = uStack_6a4 ^ local_820._28_4_;
      auVar145 = vfmadd231ps_fma(auVar40,auVar230,_local_6e0);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar145),auVar243,_local_5c0);
      auVar271 = vandps_avx(auVar55,ZEXT1632(auVar7));
      auVar6 = vrcpps_avx(ZEXT1632(auVar7));
      auVar158._8_4_ = 0x219392ef;
      auVar158._0_8_ = 0x219392ef219392ef;
      auVar158._12_4_ = 0x219392ef;
      auVar158._16_4_ = 0x219392ef;
      auVar158._20_4_ = 0x219392ef;
      auVar158._24_4_ = 0x219392ef;
      auVar158._28_4_ = 0x219392ef;
      auVar9 = vcmpps_avx(auVar271,auVar158,1);
      auVar232 = ZEXT3264(auVar9);
      auVar159._8_4_ = 0x3f800000;
      auVar159._0_8_ = 0x3f8000003f800000;
      auVar159._12_4_ = 0x3f800000;
      auVar159._16_4_ = 0x3f800000;
      auVar159._20_4_ = 0x3f800000;
      auVar159._24_4_ = 0x3f800000;
      auVar159._28_4_ = 0x3f800000;
      auVar202 = ZEXT1632(auVar7);
      auVar145 = vfnmadd213ps_fma(auVar6,auVar202,auVar159);
      auVar145 = vfmadd132ps_fma(ZEXT1632(auVar145),auVar6,auVar6);
      auVar244._0_4_ = auVar7._0_4_ ^ local_6c0;
      auVar244._4_4_ = auVar7._4_4_ ^ uStack_6bc;
      auVar244._8_4_ = auVar7._8_4_ ^ uStack_6b8;
      auVar244._12_4_ = auVar7._12_4_ ^ uStack_6b4;
      auVar244._16_4_ = fStack_6b0;
      auVar244._20_4_ = fStack_6ac;
      auVar244._24_4_ = fStack_6a8;
      auVar244._28_4_ = uStack_6a4;
      auVar249 = ZEXT3264(auVar244);
      auVar41._4_4_ = auVar145._4_4_ * (float)(auVar107._4_4_ ^ uStack_6bc);
      auVar41._0_4_ = auVar145._0_4_ * (float)(auVar107._0_4_ ^ local_6c0);
      auVar41._8_4_ = auVar145._8_4_ * (float)(auVar107._8_4_ ^ uStack_6b8);
      auVar41._12_4_ = auVar145._12_4_ * (float)(auVar107._12_4_ ^ uStack_6b4);
      auVar41._16_4_ = fStack_6b0 * 0.0;
      auVar41._20_4_ = fStack_6ac * 0.0;
      auVar41._24_4_ = fStack_6a8 * 0.0;
      auVar41._28_4_ = uStack_6a4;
      auVar264 = ZEXT3264(auVar41);
      auVar271 = vcmpps_avx(auVar202,auVar244,1);
      auVar271 = vorps_avx(auVar271,auVar9);
      auVar119._8_4_ = 0xff800000;
      auVar119._0_8_ = 0xff800000ff800000;
      auVar119._12_4_ = 0xff800000;
      auVar119._16_4_ = 0xff800000;
      auVar119._20_4_ = 0xff800000;
      auVar119._24_4_ = 0xff800000;
      auVar119._28_4_ = 0xff800000;
      auVar271 = vblendvps_avx(auVar41,auVar119,auVar271);
      _local_7a0 = vmaxps_avx(auVar120,auVar271);
      auVar269 = ZEXT3264(local_400);
      auVar271 = vcmpps_avx(auVar202,auVar244,6);
      auVar271 = vorps_avx(auVar9,auVar271);
      auVar271 = vblendvps_avx(auVar41,auVar275,auVar271);
      auVar112 = vandps_avx(local_400,auVar112);
      local_480 = vminps_avx(auVar15,auVar271);
      auVar271 = vcmpps_avx(_local_7a0,local_480,2);
      auVar9 = auVar112 & auVar271;
      if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar9 >> 0x7f,0) != '\0') ||
            (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar9 >> 0xbf,0) != '\0') ||
          (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar9[0x1f] < '\0')
      {
        auVar59._4_4_ = fStack_57c;
        auVar59._0_4_ = local_580;
        auVar59._8_4_ = fStack_578;
        auVar59._12_4_ = fStack_574;
        auVar59._16_4_ = fStack_570;
        auVar59._20_4_ = fStack_56c;
        auVar59._24_4_ = fStack_568;
        auVar59._28_4_ = fStack_564;
        auVar160._8_4_ = 0x3f800000;
        auVar160._0_8_ = 0x3f8000003f800000;
        auVar160._12_4_ = 0x3f800000;
        auVar160._16_4_ = 0x3f800000;
        auVar160._20_4_ = 0x3f800000;
        auVar160._24_4_ = 0x3f800000;
        auVar160._28_4_ = 0x3f800000;
        auVar9 = vminps_avx(auVar59,auVar160);
        auVar53 = ZEXT812(0);
        auVar277 = ZEXT1264(auVar53) << 0x20;
        auVar9 = vmaxps_avx(auVar9,ZEXT1232(auVar53) << 0x20);
        auVar120 = vminps_avx(_local_5a0,auVar160);
        auVar120 = vmaxps_avx(auVar120,ZEXT1232(auVar53) << 0x20);
        auVar42._4_4_ = (auVar9._4_4_ + 1.0) * 0.125;
        auVar42._0_4_ = (auVar9._0_4_ + 0.0) * 0.125;
        auVar42._8_4_ = (auVar9._8_4_ + 2.0) * 0.125;
        auVar42._12_4_ = (auVar9._12_4_ + 3.0) * 0.125;
        auVar42._16_4_ = (auVar9._16_4_ + 4.0) * 0.125;
        auVar42._20_4_ = (auVar9._20_4_ + 5.0) * 0.125;
        auVar42._24_4_ = (auVar9._24_4_ + 6.0) * 0.125;
        auVar42._28_4_ = auVar9._28_4_ + 7.0;
        auVar145 = vfmadd213ps_fma(auVar42,local_680,local_840);
        auVar43._4_4_ = (auVar120._4_4_ + 1.0) * 0.125;
        auVar43._0_4_ = (auVar120._0_4_ + 0.0) * 0.125;
        auVar43._8_4_ = (auVar120._8_4_ + 2.0) * 0.125;
        auVar43._12_4_ = (auVar120._12_4_ + 3.0) * 0.125;
        auVar43._16_4_ = (auVar120._16_4_ + 4.0) * 0.125;
        auVar43._20_4_ = (auVar120._20_4_ + 5.0) * 0.125;
        auVar43._24_4_ = (auVar120._24_4_ + 6.0) * 0.125;
        auVar43._28_4_ = auVar120._28_4_ + 7.0;
        auVar107 = vfmadd213ps_fma(auVar43,local_680,local_840);
        auVar9 = vminps_avx(auVar272,auVar224);
        auVar120 = vminps_avx(auVar17,auVar18);
        auVar9 = vminps_avx(auVar9,auVar120);
        auVar229 = vsubps_avx(auVar9,auVar229);
        auVar112 = vandps_avx(auVar271,auVar112);
        local_1a0 = ZEXT1632(auVar145);
        local_1c0 = ZEXT1632(auVar107);
        auVar44._4_4_ = auVar229._4_4_ * 0.99999976;
        auVar44._0_4_ = auVar229._0_4_ * 0.99999976;
        auVar44._8_4_ = auVar229._8_4_ * 0.99999976;
        auVar44._12_4_ = auVar229._12_4_ * 0.99999976;
        auVar44._16_4_ = auVar229._16_4_ * 0.99999976;
        auVar44._20_4_ = auVar229._20_4_ * 0.99999976;
        auVar44._24_4_ = auVar229._24_4_ * 0.99999976;
        auVar44._28_4_ = auVar229._28_4_;
        auVar271 = vmaxps_avx(ZEXT832(0) << 0x20,auVar44);
        auVar45._4_4_ = auVar271._4_4_ * auVar271._4_4_;
        auVar45._0_4_ = auVar271._0_4_ * auVar271._0_4_;
        auVar45._8_4_ = auVar271._8_4_ * auVar271._8_4_;
        auVar45._12_4_ = auVar271._12_4_ * auVar271._12_4_;
        auVar45._16_4_ = auVar271._16_4_ * auVar271._16_4_;
        auVar45._20_4_ = auVar271._20_4_ * auVar271._20_4_;
        auVar45._24_4_ = auVar271._24_4_ * auVar271._24_4_;
        auVar45._28_4_ = auVar271._28_4_;
        auVar229 = vsubps_avx(auVar255,auVar45);
        auVar46._4_4_ = auVar229._4_4_ * fVar235 * 4.0;
        auVar46._0_4_ = auVar229._0_4_ * fVar233 * 4.0;
        auVar46._8_4_ = auVar229._8_4_ * fVar237 * 4.0;
        auVar46._12_4_ = auVar229._12_4_ * fVar207 * 4.0;
        auVar46._16_4_ = auVar229._16_4_ * fVar217 * 4.0;
        auVar46._20_4_ = auVar229._20_4_ * fVar218 * 4.0;
        auVar46._24_4_ = auVar229._24_4_ * fVar219 * 4.0;
        auVar46._28_4_ = auVar271._28_4_;
        auVar9 = vsubps_avx(auVar32,auVar46);
        _local_8a0 = vcmpps_avx(auVar9,ZEXT1232(auVar53) << 0x20,5);
        auVar271 = _local_8a0;
        if ((((((((_local_8a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (_local_8a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (_local_8a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(_local_8a0 >> 0x7f,0) == '\0') &&
              (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(_local_8a0 >> 0xbf,0) == '\0') &&
            (_local_8a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8a0[0x1f]) {
          auVar120 = SUB6432(ZEXT864(0),0) << 0x20;
          local_760 = ZEXT832(0) << 0x20;
          _local_780 = ZEXT832(0) << 0x20;
          auVar255 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar169 = ZEXT864(0) << 0x20;
          auVar231._8_4_ = 0x7f800000;
          auVar231._0_8_ = 0x7f8000007f800000;
          auVar231._12_4_ = 0x7f800000;
          auVar231._16_4_ = 0x7f800000;
          auVar231._20_4_ = 0x7f800000;
          auVar231._24_4_ = 0x7f800000;
          auVar231._28_4_ = 0x7f800000;
          auVar249 = ZEXT3264(CONCAT428(0xff800000,
                                        CONCAT424(0xff800000,
                                                  CONCAT420(0xff800000,
                                                            CONCAT416(0xff800000,
                                                                      CONCAT412(0xff800000,
                                                                                CONCAT48(0xff800000,
                                                                                                                                                                                  
                                                  0xff800000ff800000)))))));
          _local_8a0 = auVar16;
          _local_740 = local_760;
        }
        else {
          auVar255 = vsqrtps_avx(auVar9);
          auVar245._0_4_ = fVar233 + fVar233;
          auVar245._4_4_ = fVar235 + fVar235;
          auVar245._8_4_ = fVar237 + fVar237;
          auVar245._12_4_ = fVar207 + fVar207;
          auVar245._16_4_ = fVar217 + fVar217;
          auVar245._20_4_ = fVar218 + fVar218;
          auVar245._24_4_ = fVar219 + fVar219;
          auVar245._28_4_ = fVar190 + fVar190;
          auVar120 = vrcpps_avx(auVar245);
          auVar121._8_4_ = 0x3f800000;
          auVar121._0_8_ = 0x3f8000003f800000;
          auVar121._12_4_ = 0x3f800000;
          auVar121._16_4_ = 0x3f800000;
          auVar121._20_4_ = 0x3f800000;
          auVar121._24_4_ = 0x3f800000;
          auVar121._28_4_ = 0x3f800000;
          auVar145 = vfnmadd213ps_fma(auVar245,auVar120,auVar121);
          auVar145 = vfmadd132ps_fma(ZEXT1632(auVar145),auVar120,auVar120);
          auVar267._0_4_ = (uint)local_900._0_4_ ^ local_6c0;
          auVar267._4_4_ = (uint)local_900._4_4_ ^ uStack_6bc;
          auVar267._8_4_ = (uint)local_900._8_4_ ^ uStack_6b8;
          auVar267._12_4_ = (uint)local_900._12_4_ ^ uStack_6b4;
          auVar267._16_4_ = (uint)local_900._16_4_ ^ (uint)fStack_6b0;
          auVar267._20_4_ = (uint)local_900._20_4_ ^ (uint)fStack_6ac;
          auVar267._24_4_ = (uint)local_900._24_4_ ^ (uint)fStack_6a8;
          auVar267._28_4_ = (uint)local_900._28_4_ ^ uStack_6a4;
          auVar120 = vsubps_avx(auVar267,auVar255);
          auVar15 = vsubps_avx(auVar255,local_900);
          fVar190 = auVar120._0_4_ * auVar145._0_4_;
          fVar233 = auVar120._4_4_ * auVar145._4_4_;
          auVar47._4_4_ = fVar233;
          auVar47._0_4_ = fVar190;
          fVar235 = auVar120._8_4_ * auVar145._8_4_;
          auVar47._8_4_ = fVar235;
          fVar237 = auVar120._12_4_ * auVar145._12_4_;
          auVar47._12_4_ = fVar237;
          fVar207 = auVar120._16_4_ * 0.0;
          auVar47._16_4_ = fVar207;
          fVar217 = auVar120._20_4_ * 0.0;
          auVar47._20_4_ = fVar217;
          fVar218 = auVar120._24_4_ * 0.0;
          auVar47._24_4_ = fVar218;
          auVar47._28_4_ = auVar255._28_4_;
          fVar219 = auVar15._0_4_ * auVar145._0_4_;
          fVar250 = auVar15._4_4_ * auVar145._4_4_;
          auVar48._4_4_ = fVar250;
          auVar48._0_4_ = fVar219;
          fVar251 = auVar15._8_4_ * auVar145._8_4_;
          auVar48._8_4_ = fVar251;
          fVar252 = auVar15._12_4_ * auVar145._12_4_;
          auVar48._12_4_ = fVar252;
          fVar261 = auVar15._16_4_ * 0.0;
          auVar48._16_4_ = fVar261;
          fVar204 = auVar15._20_4_ * 0.0;
          auVar48._20_4_ = fVar204;
          fVar205 = auVar15._24_4_ * 0.0;
          auVar48._24_4_ = fVar205;
          auVar48._28_4_ = auVar120._28_4_;
          auVar269 = ZEXT3264(auVar48);
          auVar145 = vfmadd213ps_fma(auVar260,auVar47,auVar284);
          auVar107 = vfmadd213ps_fma(auVar260,auVar48,auVar284);
          auVar120 = ZEXT1632(CONCAT412(fVar236 * auVar145._12_4_,
                                        CONCAT48(fVar234 * auVar145._8_4_,
                                                 CONCAT44(fVar226 * auVar145._4_4_,
                                                          fVar94 * auVar145._0_4_))));
          auVar255 = ZEXT1632(CONCAT412(fVar236 * auVar107._12_4_,
                                        CONCAT48(fVar234 * auVar107._8_4_,
                                                 CONCAT44(fVar226 * auVar107._4_4_,
                                                          fVar94 * auVar107._0_4_))));
          auVar145 = vfmadd213ps_fma(auVar11,auVar120,local_7e0);
          auVar107 = vfmadd213ps_fma(auVar11,auVar255,local_7e0);
          auVar7 = vfmadd213ps_fma(auVar13,auVar120,local_a20);
          auVar257 = vfmadd213ps_fma(auVar13,auVar255,local_a20);
          auVar8 = vfmadd213ps_fma(auVar120,auVar12,auVar156);
          auVar228 = vfmadd213ps_fma(auVar12,auVar255,auVar156);
          auVar49._4_4_ = (float)local_5c0._4_4_ * fVar233;
          auVar49._0_4_ = (float)local_5c0._0_4_ * fVar190;
          auVar49._8_4_ = fStack_5b8 * fVar235;
          auVar49._12_4_ = fStack_5b4 * fVar237;
          auVar49._16_4_ = fStack_5b0 * fVar207;
          auVar49._20_4_ = fStack_5ac * fVar217;
          auVar49._24_4_ = fStack_5a8 * fVar218;
          auVar49._28_4_ = 0;
          auVar120 = vsubps_avx(auVar49,ZEXT1632(auVar145));
          auVar80._4_4_ = (float)local_6e0._4_4_ * fVar233;
          auVar80._0_4_ = (float)local_6e0._0_4_ * fVar190;
          auVar80._8_4_ = fStack_6d8 * fVar235;
          auVar80._12_4_ = fStack_6d4 * fVar237;
          auVar80._16_4_ = fStack_6d0 * fVar207;
          auVar80._20_4_ = fStack_6cc * fVar217;
          auVar80._24_4_ = fStack_6c8 * fVar218;
          auVar80._28_4_ = 0;
          auVar255 = vsubps_avx(auVar80,ZEXT1632(auVar7));
          auVar277 = ZEXT3264(CONCAT428(fStack_6e4,
                                        CONCAT424(fStack_6e8,
                                                  CONCAT420(fStack_6ec,
                                                            CONCAT416(fStack_6f0,
                                                                      CONCAT412(fStack_6f4,
                                                                                CONCAT48(fStack_6f8,
                                                                                         CONCAT44(
                                                  fStack_6fc,local_700))))))));
          auVar161._0_4_ = local_700 * fVar190;
          auVar161._4_4_ = fStack_6fc * fVar233;
          auVar161._8_4_ = fStack_6f8 * fVar235;
          auVar161._12_4_ = fStack_6f4 * fVar237;
          auVar161._16_4_ = fStack_6f0 * fVar207;
          auVar161._20_4_ = fStack_6ec * fVar217;
          auVar161._24_4_ = fStack_6e8 * fVar218;
          auVar161._28_4_ = 0;
          auVar11 = vsubps_avx(auVar161,ZEXT1632(auVar8));
          auVar169 = ZEXT3264(auVar11);
          auVar246._0_4_ = (float)local_5c0._0_4_ * fVar219;
          auVar246._4_4_ = (float)local_5c0._4_4_ * fVar250;
          auVar246._8_4_ = fStack_5b8 * fVar251;
          auVar246._12_4_ = fStack_5b4 * fVar252;
          auVar246._16_4_ = fStack_5b0 * fVar261;
          auVar246._20_4_ = fStack_5ac * fVar204;
          auVar246._24_4_ = fStack_5a8 * fVar205;
          auVar246._28_4_ = 0;
          _local_740 = vsubps_avx(auVar246,ZEXT1632(auVar107));
          auVar50._4_4_ = (float)local_6e0._4_4_ * fVar250;
          auVar50._0_4_ = (float)local_6e0._0_4_ * fVar219;
          auVar50._8_4_ = fStack_6d8 * fVar251;
          auVar50._12_4_ = fStack_6d4 * fVar252;
          auVar50._16_4_ = fStack_6d0 * fVar261;
          auVar50._20_4_ = fStack_6cc * fVar204;
          auVar50._24_4_ = fStack_6c8 * fVar205;
          auVar50._28_4_ = local_740._28_4_;
          local_760 = vsubps_avx(auVar50,ZEXT1632(auVar257));
          auVar51._4_4_ = fStack_6fc * fVar250;
          auVar51._0_4_ = local_700 * fVar219;
          auVar51._8_4_ = fStack_6f8 * fVar251;
          auVar51._12_4_ = fStack_6f4 * fVar252;
          auVar51._16_4_ = fStack_6f0 * fVar261;
          auVar51._20_4_ = fStack_6ec * fVar204;
          auVar51._24_4_ = fStack_6e8 * fVar205;
          auVar51._28_4_ = local_760._28_4_;
          _local_780 = vsubps_avx(auVar51,ZEXT1632(auVar228));
          auVar11 = vcmpps_avx(auVar9,_DAT_01faff00,5);
          auVar247._8_4_ = 0x7f800000;
          auVar247._0_8_ = 0x7f8000007f800000;
          auVar247._12_4_ = 0x7f800000;
          auVar247._16_4_ = 0x7f800000;
          auVar247._20_4_ = 0x7f800000;
          auVar247._24_4_ = 0x7f800000;
          auVar247._28_4_ = 0x7f800000;
          auVar231 = vblendvps_avx(auVar247,auVar47,auVar11);
          auVar56._4_4_ = uStack_71c;
          auVar56._0_4_ = local_720;
          auVar56._8_4_ = uStack_718;
          auVar56._12_4_ = uStack_714;
          auVar56._16_4_ = uStack_710;
          auVar56._20_4_ = uStack_70c;
          auVar56._24_4_ = uStack_708;
          auVar56._28_4_ = uStack_704;
          auVar9 = vandps_avx(auVar56,auVar21);
          auVar9 = vmaxps_avx(local_420,auVar9);
          auVar52._4_4_ = auVar9._4_4_ * 1.9073486e-06;
          auVar52._0_4_ = auVar9._0_4_ * 1.9073486e-06;
          auVar52._8_4_ = auVar9._8_4_ * 1.9073486e-06;
          auVar52._12_4_ = auVar9._12_4_ * 1.9073486e-06;
          auVar52._16_4_ = auVar9._16_4_ * 1.9073486e-06;
          auVar52._20_4_ = auVar9._20_4_ * 1.9073486e-06;
          auVar52._24_4_ = auVar9._24_4_ * 1.9073486e-06;
          auVar52._28_4_ = auVar9._28_4_;
          auVar9 = vandps_avx(auVar56,auVar14);
          auVar12 = vcmpps_avx(auVar9,auVar52,1);
          auVar248._8_4_ = 0xff800000;
          auVar248._0_8_ = 0xff800000ff800000;
          auVar248._12_4_ = 0xff800000;
          auVar248._16_4_ = 0xff800000;
          auVar248._20_4_ = 0xff800000;
          auVar248._24_4_ = 0xff800000;
          auVar248._28_4_ = 0xff800000;
          auVar9 = vblendvps_avx(auVar248,auVar48,auVar11);
          auVar249 = ZEXT3264(auVar9);
          auVar14 = auVar11 & auVar12;
          if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0x7f,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0xbf,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar14[0x1f] < '\0') {
            auVar271 = vandps_avx(auVar12,auVar11);
            auVar12 = vcmpps_avx(auVar229,ZEXT832(0) << 0x20,2);
            auVar268._8_4_ = 0xff800000;
            auVar268._0_8_ = 0xff800000ff800000;
            auVar268._12_4_ = 0xff800000;
            auVar268._16_4_ = 0xff800000;
            auVar268._20_4_ = 0xff800000;
            auVar268._24_4_ = 0xff800000;
            auVar268._28_4_ = 0xff800000;
            auVar269 = ZEXT3264(auVar268);
            auVar276._8_4_ = 0x7f800000;
            auVar276._0_8_ = 0x7f8000007f800000;
            auVar276._12_4_ = 0x7f800000;
            auVar276._16_4_ = 0x7f800000;
            auVar276._20_4_ = 0x7f800000;
            auVar276._24_4_ = 0x7f800000;
            auVar276._28_4_ = 0x7f800000;
            auVar277 = ZEXT3264(auVar276);
            auVar229 = vblendvps_avx(auVar276,auVar268,auVar12);
            auVar145 = vpackssdw_avx(auVar271._0_16_,auVar271._16_16_);
            auVar14 = vpmovsxwd_avx2(auVar145);
            auVar231 = vblendvps_avx(auVar231,auVar229,auVar14);
            auVar229 = vblendvps_avx(auVar268,auVar276,auVar12);
            auVar229 = vblendvps_avx(auVar9,auVar229,auVar14);
            auVar249 = ZEXT3264(auVar229);
            auVar216._0_8_ = auVar271._0_8_ ^ 0xffffffffffffffff;
            auVar216._8_4_ = auVar271._8_4_ ^ 0xffffffff;
            auVar216._12_4_ = auVar271._12_4_ ^ 0xffffffff;
            auVar216._16_4_ = auVar271._16_4_ ^ 0xffffffff;
            auVar216._20_4_ = auVar271._20_4_ ^ 0xffffffff;
            auVar216._24_4_ = auVar271._24_4_ ^ 0xffffffff;
            auVar216._28_4_ = auVar271._28_4_ ^ 0xffffffff;
            auVar271 = vorps_avx(auVar12,auVar216);
            auVar271 = vandps_avx(auVar11,auVar271);
          }
        }
        uVar93 = *(undefined4 *)&(ray->dir).field_0;
        local_560._4_4_ = uVar93;
        local_560._0_4_ = uVar93;
        local_560._8_4_ = uVar93;
        local_560._12_4_ = uVar93;
        local_560._16_4_ = uVar93;
        local_560._20_4_ = uVar93;
        local_560._24_4_ = uVar93;
        local_560._28_4_ = uVar93;
        uVar93 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
        auVar263._4_4_ = uVar93;
        auVar263._0_4_ = uVar93;
        auVar263._8_4_ = uVar93;
        auVar263._12_4_ = uVar93;
        auVar263._16_4_ = uVar93;
        auVar263._20_4_ = uVar93;
        auVar263._24_4_ = uVar93;
        auVar263._28_4_ = uVar93;
        auVar264 = ZEXT3264(auVar263);
        fVar190 = (ray->dir).field_0.m128[2];
        local_460 = _local_7a0;
        local_440 = vminps_avx(local_480,auVar231);
        local_600 = vmaxps_avx(_local_7a0,auVar249._0_32_);
        auVar232 = ZEXT3264(local_600);
        local_4a0 = local_600;
        auVar229 = vcmpps_avx(_local_7a0,local_440,2);
        local_500 = vandps_avx(auVar229,auVar112);
        auVar229 = vcmpps_avx(local_600,local_480,2);
        local_520 = vandps_avx(auVar229,auVar112);
        auVar112 = vorps_avx(local_520,local_500);
        if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar112 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar112 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar112 >> 0x7f,0) != '\0') ||
              (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar112 >> 0xbf,0) != '\0') ||
            (auVar112 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar112[0x1f] < '\0') {
          auVar215._0_8_ = auVar271._0_8_ ^ 0xffffffffffffffff;
          auVar215._8_4_ = auVar271._8_4_ ^ 0xffffffff;
          auVar215._12_4_ = auVar271._12_4_ ^ 0xffffffff;
          auVar215._16_4_ = auVar271._16_4_ ^ 0xffffffff;
          auVar215._20_4_ = auVar271._20_4_ ^ 0xffffffff;
          auVar215._24_4_ = auVar271._24_4_ ^ 0xffffffff;
          auVar215._28_4_ = auVar271._28_4_ ^ 0xffffffff;
          auVar170._0_4_ = fVar190 * auVar169._0_4_;
          auVar170._4_4_ = fVar190 * auVar169._4_4_;
          auVar170._8_4_ = fVar190 * auVar169._8_4_;
          auVar170._12_4_ = fVar190 * auVar169._12_4_;
          auVar170._16_4_ = fVar190 * auVar169._16_4_;
          auVar170._20_4_ = fVar190 * auVar169._20_4_;
          auVar170._28_36_ = auVar169._28_36_;
          auVar170._24_4_ = fVar190 * auVar169._24_4_;
          auVar145 = vfmadd213ps_fma(auVar255,auVar263,auVar170._0_32_);
          auVar145 = vfmadd213ps_fma(auVar120,local_560,ZEXT1632(auVar145));
          auVar57._4_4_ = uStack_71c;
          auVar57._0_4_ = local_720;
          auVar57._8_4_ = uStack_718;
          auVar57._12_4_ = uStack_714;
          auVar57._16_4_ = uStack_710;
          auVar57._20_4_ = uStack_70c;
          auVar57._24_4_ = uStack_708;
          auVar57._28_4_ = uStack_704;
          auVar112 = vandps_avx(ZEXT1632(auVar145),auVar57);
          auVar141._8_4_ = 0x3e99999a;
          auVar141._0_8_ = 0x3e99999a3e99999a;
          auVar141._12_4_ = 0x3e99999a;
          auVar141._16_4_ = 0x3e99999a;
          auVar141._20_4_ = 0x3e99999a;
          auVar141._24_4_ = 0x3e99999a;
          auVar141._28_4_ = 0x3e99999a;
          auVar112 = vcmpps_avx(auVar112,auVar141,1);
          auVar112 = vorps_avx(auVar112,auVar215);
          auVar142._8_4_ = 3;
          auVar142._0_8_ = 0x300000003;
          auVar142._12_4_ = 3;
          auVar142._16_4_ = 3;
          auVar142._20_4_ = 3;
          auVar142._24_4_ = 3;
          auVar142._28_4_ = 3;
          auVar163._8_4_ = 2;
          auVar163._0_8_ = 0x200000002;
          auVar163._12_4_ = 2;
          auVar163._16_4_ = 2;
          auVar163._20_4_ = 2;
          auVar163._24_4_ = 2;
          auVar163._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar163,auVar142,auVar112);
          local_540._4_4_ = local_ac4;
          local_540._0_4_ = local_ac4;
          local_540._8_4_ = local_ac4;
          local_540._12_4_ = local_ac4;
          local_540._16_4_ = local_ac4;
          local_540._20_4_ = local_ac4;
          local_540._24_4_ = local_ac4;
          local_540._28_4_ = local_ac4;
          local_5e0 = vpcmpgtd_avx2(auVar112,local_540);
          local_4e0 = vpandn_avx2(local_5e0,local_500);
          auVar169 = ZEXT3264(local_4e0);
          auVar112 = local_500 & ~local_5e0;
          if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar112 >> 0x7f,0) == '\0') &&
                (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar112 >> 0xbf,0) == '\0') &&
              (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar112[0x1f]) {
            fVar94 = ray->tfar;
            auVar124._4_4_ = fVar94;
            auVar124._0_4_ = fVar94;
            auVar124._8_4_ = fVar94;
            auVar124._12_4_ = fVar94;
            auVar124._16_4_ = fVar94;
            auVar124._20_4_ = fVar94;
            auVar124._24_4_ = fVar94;
            auVar124._28_4_ = fVar94;
            auVar112 = local_560;
            fVar94 = fVar190;
            fVar226 = fVar190;
            fVar233 = fVar190;
            fVar234 = fVar190;
            fVar235 = fVar190;
            fVar236 = fVar190;
            local_560 = auVar13;
          }
          else {
            auVar107 = vminps_avx(local_960,local_980);
            auVar145 = vmaxps_avx(local_960,local_980);
            auVar7 = vminps_avx(local_970,_local_990);
            auVar257 = vminps_avx(auVar107,auVar7);
            auVar107 = vmaxps_avx(local_970,_local_990);
            auVar7 = vmaxps_avx(auVar145,auVar107);
            auVar145 = vandps_avx(auVar257,local_9a0);
            auVar107 = vandps_avx(auVar7,local_9a0);
            auVar145 = vmaxps_avx(auVar145,auVar107);
            auVar107 = vmovshdup_avx(auVar145);
            auVar107 = vmaxss_avx(auVar107,auVar145);
            auVar145 = vshufpd_avx(auVar145,auVar145,1);
            auVar145 = vmaxss_avx(auVar145,auVar107);
            fVar94 = auVar145._0_4_ * 1.9073486e-06;
            local_6a0 = vshufps_avx(auVar7,auVar7,0xff);
            local_920._4_4_ = (float)local_a40._4_4_ + (float)local_7a0._4_4_;
            local_920._0_4_ = (float)local_a40._0_4_ + (float)local_7a0._0_4_;
            fStack_918 = fStack_a38 + fStack_798;
            fStack_914 = fStack_a34 + fStack_794;
            fStack_910 = fStack_a30 + fStack_790;
            fStack_90c = fStack_a2c + fStack_78c;
            fStack_908 = fStack_a28 + fStack_788;
            fStack_904 = fStack_a24 + fStack_784;
            local_620 = auVar263;
            _local_5a0 = auVar215;
            local_580 = fVar190;
            fStack_57c = fVar190;
            fStack_578 = fVar190;
            fStack_574 = fVar190;
            fStack_570 = fVar190;
            fStack_56c = fVar190;
            fStack_568 = fVar190;
            fStack_564 = fVar190;
            do {
              auVar125._8_4_ = 0x7f800000;
              auVar125._0_8_ = 0x7f8000007f800000;
              auVar125._12_4_ = 0x7f800000;
              auVar125._16_4_ = 0x7f800000;
              auVar125._20_4_ = 0x7f800000;
              auVar125._24_4_ = 0x7f800000;
              auVar125._28_4_ = 0x7f800000;
              auVar112 = auVar169._0_32_;
              auVar271 = vblendvps_avx(auVar125,_local_7a0,auVar112);
              auVar229 = vshufps_avx(auVar271,auVar271,0xb1);
              auVar229 = vminps_avx(auVar271,auVar229);
              auVar9 = vshufpd_avx(auVar229,auVar229,5);
              auVar229 = vminps_avx(auVar229,auVar9);
              auVar9 = vpermpd_avx2(auVar229,0x4e);
              auVar229 = vminps_avx(auVar229,auVar9);
              auVar271 = vcmpps_avx(auVar271,auVar229,0);
              auVar229 = auVar112 & auVar271;
              if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar229 >> 0x7f,0) != '\0') ||
                    (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar229 >> 0xbf,0) != '\0') ||
                  (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar229[0x1f] < '\0') {
                auVar112 = vandps_avx(auVar271,auVar112);
              }
              uVar85 = vmovmskps_avx(auVar112);
              iVar19 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar86 = iVar19 << 2;
              *(undefined4 *)(local_4e0 + uVar86) = 0;
              aVar1 = (ray->dir).field_0;
              local_7e0._0_16_ = (undefined1  [16])aVar1;
              auVar145 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar85 = *(uint *)(local_1a0 + uVar86);
              if (auVar145._0_4_ < 0.0) {
                local_a20._0_16_ = ZEXT416(*(uint *)(local_460 + uVar86));
                fVar190 = sqrtf(auVar145._0_4_);
                auVar145 = local_a20._0_16_;
              }
              else {
                auVar145 = vsqrtss_avx(auVar145,auVar145);
                fVar190 = auVar145._0_4_;
                auVar145 = ZEXT416(*(uint *)(local_460 + uVar86));
              }
              local_820._0_4_ = fVar190 * 1.9073486e-06;
              auVar145 = vinsertps_avx(auVar145,ZEXT416(uVar85),0x10);
              bVar92 = true;
              uVar87 = 0;
              do {
                fVar237 = auVar145._0_4_;
                auVar102._4_4_ = fVar237;
                auVar102._0_4_ = fVar237;
                auVar102._8_4_ = fVar237;
                auVar102._12_4_ = fVar237;
                auVar7 = vfmadd213ps_fma(auVar102,local_7e0._0_16_,_DAT_01f7aa10);
                local_8c0._0_16_ = vmovshdup_avx(auVar145);
                fVar235 = local_8c0._0_4_;
                fVar236 = 1.0 - fVar235;
                auVar277 = ZEXT464((uint)fVar236);
                fVar190 = fVar235 * fVar235;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar228 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar257 = vfmadd213ss_fma(auVar99,local_8c0._0_16_,auVar228);
                auVar107 = vfmadd213ss_fma(auVar257,ZEXT416((uint)fVar190),
                                           SUB6416(ZEXT464(0x40000000),0));
                local_800._0_16_ = ZEXT416((uint)fVar236);
                auVar8 = vfmadd213ss_fma(auVar99,local_800._0_16_,auVar228);
                auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)(fVar236 * fVar236)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar226 = fVar236 * fVar236 * -fVar235 * 0.5;
                fVar233 = auVar107._0_4_ * 0.5;
                fVar234 = auVar8._0_4_ * 0.5;
                fVar235 = fVar235 * fVar235 * -fVar236 * 0.5;
                auVar172._0_4_ = fVar235 * (float)local_990._0_4_;
                auVar172._4_4_ = fVar235 * (float)local_990._4_4_;
                auVar172._8_4_ = fVar235 * fStack_988;
                auVar172._12_4_ = fVar235 * fStack_984;
                auVar193._4_4_ = fVar234;
                auVar193._0_4_ = fVar234;
                auVar193._8_4_ = fVar234;
                auVar193._12_4_ = fVar234;
                auVar107 = vfmadd132ps_fma(auVar193,auVar172,local_970);
                auVar146._4_4_ = fVar233;
                auVar146._0_4_ = fVar233;
                auVar146._8_4_ = fVar233;
                auVar146._12_4_ = fVar233;
                auVar107 = vfmadd132ps_fma(auVar146,auVar107,local_980);
                auVar173._4_4_ = fVar226;
                auVar173._0_4_ = fVar226;
                auVar173._8_4_ = fVar226;
                auVar173._12_4_ = fVar226;
                auVar107 = vfmadd132ps_fma(auVar173,auVar107,local_960);
                auVar228 = vfmadd231ss_fma(auVar228,local_8c0._0_16_,ZEXT416(0x41100000));
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_8c0._0_16_,
                                         ZEXT416(0x40800000));
                local_8e0._0_16_ = auVar8;
                local_660._0_16_ = auVar107;
                auVar107 = vsubps_avx(auVar7,auVar107);
                _local_8a0 = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar7 = vfmadd213ss_fma(auVar99,local_8c0._0_16_,ZEXT416(0xbf800000));
                local_9c0._0_16_ = auVar7;
                local_a20._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_9e0._0_4_ = auVar257._0_4_;
                  local_a00._0_4_ = fVar190;
                  local_900._0_16_ = auVar228;
                  local_840._0_4_ = fVar236 * -2.0;
                  auVar169._0_4_ = sqrtf(auVar107._0_4_);
                  auVar169._4_60_ = extraout_var;
                  auVar277 = ZEXT1664(local_800._0_16_);
                  auVar257 = ZEXT416((uint)local_9e0._0_4_);
                  auVar107 = auVar169._0_16_;
                  fVar226 = (float)local_840._0_4_;
                  fVar190 = (float)local_a00._0_4_;
                  auVar228 = local_900._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar226 = fVar236 * -2.0;
                }
                fVar234 = auVar277._0_4_;
                fVar233 = local_8c0._0_4_;
                auVar257 = vfmadd213ss_fma(auVar257,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar144 = SUB6416(ZEXT464(0x40000000),0);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8c0._0_16_,auVar144);
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar234 * -3.0)),
                                         ZEXT416((uint)(fVar234 + fVar234)),auVar7);
                auVar129 = auVar277._0_16_;
                auVar99 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar234 + fVar234))),auVar129,
                                           auVar129);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar226),local_8c0._0_16_,
                                         ZEXT416((uint)fVar190));
                fVar190 = auVar8._0_4_ * 0.5;
                fVar226 = auVar7._0_4_ * 0.5;
                auVar147._0_4_ = (float)local_990._0_4_ * fVar226;
                auVar147._4_4_ = (float)local_990._4_4_ * fVar226;
                auVar147._8_4_ = fStack_988 * fVar226;
                auVar147._12_4_ = fStack_984 * fVar226;
                auVar131._4_4_ = fVar190;
                auVar131._0_4_ = fVar190;
                auVar131._8_4_ = fVar190;
                auVar131._12_4_ = fVar190;
                auVar7 = vfmadd213ps_fma(auVar131,local_970,auVar147);
                fVar190 = auVar99._0_4_ * 0.5;
                fVar226 = auVar257._0_4_ * 0.5;
                auVar148._4_4_ = fVar226;
                auVar148._0_4_ = fVar226;
                auVar148._8_4_ = fVar226;
                auVar148._12_4_ = fVar226;
                auVar7 = vfmadd213ps_fma(auVar148,local_980,auVar7);
                auVar258._4_4_ = fVar190;
                auVar258._0_4_ = fVar190;
                auVar258._8_4_ = fVar190;
                auVar258._12_4_ = fVar190;
                auVar99 = vfmadd213ps_fma(auVar258,local_960,auVar7);
                auVar98 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar144);
                auVar269 = ZEXT1664(auVar98);
                auVar103._0_4_ = (float)local_990._0_4_ * (float)local_9c0._0_4_;
                auVar103._4_4_ = (float)local_990._4_4_ * (float)local_9c0._0_4_;
                auVar103._8_4_ = fStack_988 * (float)local_9c0._0_4_;
                auVar103._12_4_ = fStack_984 * (float)local_9c0._0_4_;
                auVar132._4_4_ = local_8e0._0_4_;
                auVar132._0_4_ = local_8e0._0_4_;
                auVar132._8_4_ = local_8e0._0_4_;
                auVar132._12_4_ = local_8e0._0_4_;
                auVar7 = vfmadd213ps_fma(auVar132,local_970,auVar103);
                uVar93 = auVar228._0_4_;
                auVar149._4_4_ = uVar93;
                auVar149._0_4_ = uVar93;
                auVar149._8_4_ = uVar93;
                auVar149._12_4_ = uVar93;
                auVar7 = vfmadd213ps_fma(auVar149,local_980,auVar7);
                auVar257 = vdpps_avx(auVar99,auVar99,0x7f);
                uVar93 = auVar98._0_4_;
                auVar133._4_4_ = uVar93;
                auVar133._0_4_ = uVar93;
                auVar133._8_4_ = uVar93;
                auVar133._12_4_ = uVar93;
                auVar228 = vfmadd213ps_fma(auVar133,local_960,auVar7);
                auVar7 = vblendps_avx(auVar257,_DAT_01f7aa10,0xe);
                auVar8 = vrsqrtss_avx(auVar7,auVar7);
                fVar233 = auVar257._0_4_;
                fVar190 = auVar8._0_4_;
                auVar8 = vdpps_avx(auVar99,auVar228,0x7f);
                fVar190 = fVar190 * 1.5 + fVar233 * -0.5 * fVar190 * fVar190 * fVar190;
                auVar134._0_4_ = auVar228._0_4_ * fVar233;
                auVar134._4_4_ = auVar228._4_4_ * fVar233;
                auVar134._8_4_ = auVar228._8_4_ * fVar233;
                auVar134._12_4_ = auVar228._12_4_ * fVar233;
                fVar226 = auVar8._0_4_;
                auVar213._0_4_ = auVar99._0_4_ * fVar226;
                auVar213._4_4_ = auVar99._4_4_ * fVar226;
                fVar234 = auVar99._8_4_;
                auVar213._8_4_ = fVar234 * fVar226;
                fVar235 = auVar99._12_4_;
                auVar213._12_4_ = fVar235 * fVar226;
                auVar8 = vsubps_avx(auVar134,auVar213);
                auVar7 = vrcpss_avx(auVar7,auVar7);
                auVar228 = vfnmadd213ss_fma(auVar7,auVar257,auVar144);
                fVar226 = auVar7._0_4_ * auVar228._0_4_;
                auVar7 = vmaxss_avx(ZEXT416((uint)fVar94),
                                    ZEXT416((uint)(fVar237 * (float)local_820._0_4_)));
                auVar264 = ZEXT1664(auVar7);
                local_9e0._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                local_9e0._8_4_ = -fVar234;
                local_9e0._12_4_ = -fVar235;
                auVar174._0_4_ = fVar190 * auVar8._0_4_ * fVar226;
                auVar174._4_4_ = fVar190 * auVar8._4_4_ * fVar226;
                auVar174._8_4_ = fVar190 * auVar8._8_4_ * fVar226;
                auVar174._12_4_ = fVar190 * auVar8._12_4_ * fVar226;
                local_800._0_4_ = auVar99._0_4_ * fVar190;
                local_800._4_4_ = auVar99._4_4_ * fVar190;
                local_800._8_4_ = fVar234 * fVar190;
                local_800._12_4_ = fVar235 * fVar190;
                local_8c0._0_16_ = auVar99;
                local_8e0._0_4_ = auVar7._0_4_;
                if (fVar233 < -fVar233) {
                  local_9c0._0_4_ = auVar107._0_4_;
                  local_a00._0_16_ = auVar174;
                  auVar269 = ZEXT1664(auVar98);
                  auVar277 = ZEXT1664(auVar129);
                  fVar190 = sqrtf(fVar233);
                  auVar264 = ZEXT464((uint)local_8e0._0_4_);
                  auVar107 = ZEXT416((uint)local_9c0._0_4_);
                  auVar174 = local_a00._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar257,auVar257);
                  fVar190 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_8a0,local_800._0_16_,0x7f);
                auVar99 = vfmadd213ss_fma(ZEXT416((uint)fVar94),auVar107,auVar264._0_16_);
                auVar257 = vdpps_avx(local_9e0._0_16_,local_800._0_16_,0x7f);
                auVar8 = vdpps_avx(_local_8a0,auVar174,0x7f);
                auVar228 = vdpps_avx(local_7e0._0_16_,local_800._0_16_,0x7f);
                auVar107 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar94 / fVar190)),auVar99);
                local_9c0._0_4_ = auVar107._0_4_;
                fVar190 = auVar257._0_4_ + auVar8._0_4_;
                auVar232 = ZEXT464((uint)fVar190);
                auVar104._0_4_ = auVar7._0_4_ * auVar7._0_4_;
                auVar104._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar104._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar104._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar107 = vdpps_avx(_local_8a0,local_9e0._0_16_,0x7f);
                auVar8 = vsubps_avx(local_a20._0_16_,auVar104);
                auVar257 = vrsqrtss_avx(auVar8,auVar8);
                fVar233 = auVar8._0_4_;
                fVar226 = auVar257._0_4_;
                fVar226 = fVar226 * 1.5 + fVar233 * -0.5 * fVar226 * fVar226 * fVar226;
                auVar257 = vdpps_avx(_local_8a0,local_7e0._0_16_,0x7f);
                local_9e0._0_16_ = ZEXT416((uint)fVar190);
                local_800._0_16_ = vfnmadd231ss_fma(auVar107,auVar7,ZEXT416((uint)fVar190));
                auVar107 = vfnmadd231ss_fma(auVar257,auVar7,auVar228);
                if (fVar233 < 0.0) {
                  local_a00._0_16_ = auVar7;
                  local_900._0_16_ = auVar228;
                  local_840._0_4_ = fVar226;
                  local_680._0_16_ = auVar107;
                  auVar232 = ZEXT464((uint)fVar190);
                  auVar269 = ZEXT1664(auVar269._0_16_);
                  auVar277 = ZEXT1664(auVar277._0_16_);
                  fVar190 = sqrtf(fVar233);
                  auVar264 = ZEXT464((uint)local_8e0._0_4_);
                  fVar226 = (float)local_840._0_4_;
                  auVar107 = local_680._0_16_;
                  auVar228 = local_900._0_16_;
                  auVar7 = local_a00._0_16_;
                }
                else {
                  auVar257 = vsqrtss_avx(auVar8,auVar8);
                  fVar190 = auVar257._0_4_;
                }
                auVar257 = vpermilps_avx(local_660._0_16_,0xff);
                fVar190 = fVar190 - auVar257._0_4_;
                auVar8 = vshufps_avx(local_8c0._0_16_,local_8c0._0_16_,0xff);
                auVar257 = vfmsub213ss_fma(local_800._0_16_,ZEXT416((uint)fVar226),auVar8);
                auVar175._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
                auVar175._8_4_ = auVar228._8_4_ ^ 0x80000000;
                auVar175._12_4_ = auVar228._12_4_ ^ 0x80000000;
                auVar194._0_8_ = auVar257._0_8_ ^ 0x8000000080000000;
                auVar194._8_4_ = auVar257._8_4_ ^ 0x80000000;
                auVar194._12_4_ = auVar257._12_4_ ^ 0x80000000;
                auVar249 = ZEXT1664(local_9e0._0_16_);
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * fVar226));
                auVar257 = vfmsub231ss_fma(ZEXT416((uint)(auVar228._0_4_ * auVar257._0_4_)),
                                           local_9e0._0_16_,auVar107);
                auVar107 = vinsertps_avx(auVar194,auVar107,0x1c);
                uVar93 = auVar257._0_4_;
                auVar195._4_4_ = uVar93;
                auVar195._0_4_ = uVar93;
                auVar195._8_4_ = uVar93;
                auVar195._12_4_ = uVar93;
                auVar107 = vdivps_avx(auVar107,auVar195);
                auVar257 = vinsertps_avx(local_9e0._0_16_,auVar175,0x10);
                auVar257 = vdivps_avx(auVar257,auVar195);
                fVar226 = auVar7._0_4_;
                auVar150._0_4_ = fVar226 * auVar107._0_4_ + fVar190 * auVar257._0_4_;
                auVar150._4_4_ = fVar226 * auVar107._4_4_ + fVar190 * auVar257._4_4_;
                auVar150._8_4_ = fVar226 * auVar107._8_4_ + fVar190 * auVar257._8_4_;
                auVar150._12_4_ = fVar226 * auVar107._12_4_ + fVar190 * auVar257._12_4_;
                auVar145 = vsubps_avx(auVar145,auVar150);
                auVar107 = vandps_avx(auVar7,local_9a0);
                if (auVar107._0_4_ < (float)local_9c0._0_4_) {
                  auVar7 = vfmadd231ss_fma(ZEXT416((uint)(auVar264._0_4_ + (float)local_9c0._0_4_)),
                                           local_6a0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(ZEXT416((uint)fVar190),local_9a0);
                  if (auVar107._0_4_ < auVar7._0_4_) {
                    fVar190 = auVar145._0_4_ + (float)local_7c0._0_4_;
                    bVar82 = 0;
                    bVar81 = 0;
                    if (fVar190 < (ray->org).field_0.m128[3]) goto LAB_016068b0;
                    fVar226 = ray->tfar;
                    fVar220 = (float)local_a40._0_4_;
                    fVar221 = (float)local_a40._4_4_;
                    fVar222 = fStack_a38;
                    fVar223 = fStack_a34;
                    fVar279 = fStack_a30;
                    fVar280 = fStack_a2c;
                    fVar281 = fStack_a28;
                    fVar238 = fStack_a24;
                    if (fVar226 < fVar190) goto LAB_016068b9;
                    auVar145 = vmovshdup_avx(auVar145);
                    bVar82 = 0;
                    fVar233 = auVar145._0_4_;
                    if ((fVar233 < 0.0) || (1.0 < fVar233)) goto LAB_016068b9;
                    auVar145 = vrsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                    fVar234 = auVar145._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      bVar82 = 0;
                      goto LAB_016068b9;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar82 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_016068b9;
                    fVar234 = fVar234 * 1.5 + local_a20._0_4_ * -0.5 * fVar234 * fVar234 * fVar234;
                    auVar176._0_4_ = fVar234 * (float)local_8a0._0_4_;
                    auVar176._4_4_ = fVar234 * (float)local_8a0._4_4_;
                    auVar176._8_4_ = fVar234 * fStack_898;
                    auVar176._12_4_ = fVar234 * fStack_894;
                    auVar257 = vfmadd213ps_fma(auVar8,auVar176,local_8c0._0_16_);
                    auVar145 = vshufps_avx(auVar176,auVar176,0xc9);
                    auVar107 = vshufps_avx(local_8c0._0_16_,local_8c0._0_16_,0xc9);
                    auVar177._0_4_ = auVar176._0_4_ * auVar107._0_4_;
                    auVar177._4_4_ = auVar176._4_4_ * auVar107._4_4_;
                    auVar177._8_4_ = auVar176._8_4_ * auVar107._8_4_;
                    auVar177._12_4_ = auVar176._12_4_ * auVar107._12_4_;
                    auVar7 = vfmsub231ps_fma(auVar177,local_8c0._0_16_,auVar145);
                    auVar145 = vshufps_avx(auVar7,auVar7,0xc9);
                    auVar107 = vshufps_avx(auVar257,auVar257,0xc9);
                    auVar7 = vshufps_avx(auVar7,auVar7,0xd2);
                    auVar105._0_4_ = auVar257._0_4_ * auVar7._0_4_;
                    auVar105._4_4_ = auVar257._4_4_ * auVar7._4_4_;
                    auVar105._8_4_ = auVar257._8_4_ * auVar7._8_4_;
                    auVar105._12_4_ = auVar257._12_4_ * auVar7._12_4_;
                    auVar107 = vfmsub231ps_fma(auVar105,auVar145,auVar107);
                    auVar145 = vshufps_avx(auVar107,auVar107,0xe9);
                    local_880 = vmovlps_avx(auVar145);
                    local_878 = auVar107._0_4_;
                    local_870 = 0;
                    local_86c = (undefined4)local_848;
                    local_864 = context->user->instID[0];
                    local_860 = context->user->instPrimID[0];
                    ray->tfar = fVar190;
                    local_640._0_4_ = 0xffffffff;
                    local_950.valid = (int *)local_640;
                    local_950.geometryUserPtr = pGVar4->userPtr;
                    local_950.context = context->user;
                    local_950.hit = (RTCHitN *)&local_880;
                    local_950.N = 1;
                    local_950.ray = (RTCRayN *)ray;
                    local_874 = fVar233;
                    local_868 = uVar83;
                    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01606ad0:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar232 = ZEXT1664(auVar232._0_16_);
                        auVar249 = ZEXT1664(auVar249._0_16_);
                        auVar269 = ZEXT1664(auVar269._0_16_);
                        auVar277 = ZEXT1664(auVar277._0_16_);
                        (*p_Var5)(&local_950);
                        if (*local_950.valid == 0) goto LAB_01606b17;
                      }
                      bVar81 = 1;
                    }
                    else {
                      auVar232 = ZEXT1664(auVar232._0_16_);
                      auVar249 = ZEXT1664(local_9e0._0_16_);
                      auVar269 = ZEXT1664(auVar269._0_16_);
                      auVar277 = ZEXT1664(auVar277._0_16_);
                      (*pGVar4->occlusionFilterN)(&local_950);
                      if (*local_950.valid != 0) goto LAB_01606ad0;
LAB_01606b17:
                      ray->tfar = fVar226;
                      bVar81 = 0;
                    }
                    goto LAB_016068b0;
                  }
                }
                bVar92 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar92 = false;
              bVar81 = 5;
LAB_016068b0:
              bVar82 = bVar81;
              fVar220 = (float)local_a40._0_4_;
              fVar221 = (float)local_a40._4_4_;
              fVar222 = fStack_a38;
              fVar223 = fStack_a34;
              fVar279 = fStack_a30;
              fVar280 = fStack_a2c;
              fVar281 = fStack_a28;
              fVar238 = fStack_a24;
LAB_016068b9:
              bVar89 = (bool)(bVar89 | bVar92 & bVar82);
              fVar190 = ray->tfar;
              auVar124._4_4_ = fVar190;
              auVar124._0_4_ = fVar190;
              auVar124._8_4_ = fVar190;
              auVar124._12_4_ = fVar190;
              auVar124._16_4_ = fVar190;
              auVar124._20_4_ = fVar190;
              auVar124._24_4_ = fVar190;
              auVar124._28_4_ = fVar190;
              auVar271 = vcmpps_avx(_local_920,auVar124,2);
              auVar112 = vandps_avx(auVar271,local_4e0);
              auVar169 = ZEXT3264(auVar112);
              auVar271 = local_4e0 & auVar271;
              local_4e0 = auVar112;
            } while ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar271 >> 0x7f,0) != '\0') ||
                       (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar271 >> 0xbf,0) != '\0') ||
                     (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar271[0x1f] < '\0');
            auVar264 = ZEXT3264(local_620);
            auVar215 = _local_5a0;
            auVar112 = local_560;
            fVar190 = local_580;
            fVar94 = fStack_57c;
            fVar226 = fStack_578;
            fVar233 = fStack_574;
            fVar234 = fStack_570;
            fVar235 = fStack_56c;
            fVar236 = fStack_568;
          }
          auVar143._0_4_ = fVar190 * (float)local_780._0_4_;
          auVar143._4_4_ = fVar94 * (float)local_780._4_4_;
          auVar143._8_4_ = fVar226 * fStack_778;
          auVar143._12_4_ = fVar233 * fStack_774;
          auVar143._16_4_ = fVar234 * fStack_770;
          auVar143._20_4_ = fVar235 * fStack_76c;
          auVar143._28_36_ = auVar169._28_36_;
          auVar143._24_4_ = fVar236 * fStack_768;
          auVar145 = vfmadd213ps_fma(local_760,auVar264._0_32_,auVar143._0_32_);
          auVar145 = vfmadd213ps_fma(_local_740,auVar112,ZEXT1632(auVar145));
          auVar58._4_4_ = uStack_71c;
          auVar58._0_4_ = local_720;
          auVar58._8_4_ = uStack_718;
          auVar58._12_4_ = uStack_714;
          auVar58._16_4_ = uStack_710;
          auVar58._20_4_ = uStack_70c;
          auVar58._24_4_ = uStack_708;
          auVar58._28_4_ = uStack_704;
          auVar112 = vandps_avx(ZEXT1632(auVar145),auVar58);
          auVar164._8_4_ = 0x3e99999a;
          auVar164._0_8_ = 0x3e99999a3e99999a;
          auVar164._12_4_ = 0x3e99999a;
          auVar164._16_4_ = 0x3e99999a;
          auVar164._20_4_ = 0x3e99999a;
          auVar164._24_4_ = 0x3e99999a;
          auVar164._28_4_ = 0x3e99999a;
          auVar112 = vcmpps_avx(auVar112,auVar164,1);
          auVar271 = vorps_avx(auVar112,auVar215);
          auVar165._0_4_ = fVar220 + local_600._0_4_;
          auVar165._4_4_ = fVar221 + local_600._4_4_;
          auVar165._8_4_ = fVar222 + local_600._8_4_;
          auVar165._12_4_ = fVar223 + local_600._12_4_;
          auVar165._16_4_ = fVar279 + local_600._16_4_;
          auVar165._20_4_ = fVar280 + local_600._20_4_;
          auVar165._24_4_ = fVar281 + local_600._24_4_;
          auVar165._28_4_ = fVar238 + local_600._28_4_;
          auVar112 = vcmpps_avx(auVar165,auVar124,2);
          _local_780 = vandps_avx(auVar112,local_520);
          auVar166._8_4_ = 3;
          auVar166._0_8_ = 0x300000003;
          auVar166._12_4_ = 3;
          auVar166._16_4_ = 3;
          auVar166._20_4_ = 3;
          auVar166._24_4_ = 3;
          auVar166._28_4_ = 3;
          auVar188._8_4_ = 2;
          auVar188._0_8_ = 0x200000002;
          auVar188._12_4_ = 2;
          auVar188._16_4_ = 2;
          auVar188._20_4_ = 2;
          auVar188._24_4_ = 2;
          auVar188._28_4_ = 2;
          auVar112 = vblendvps_avx(auVar188,auVar166,auVar271);
          local_760 = vpcmpgtd_avx2(auVar112,local_540);
          auVar112 = vpandn_avx2(local_760,_local_780);
          auVar271 = _local_780 & ~local_760;
          local_640 = auVar112;
          if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar271 >> 0x7f,0) != '\0') ||
                (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar271 >> 0xbf,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar271[0x1f] < '\0') {
            auVar107 = vminps_avx(local_960,local_980);
            auVar145 = vmaxps_avx(local_960,local_980);
            auVar7 = vminps_avx(local_970,_local_990);
            auVar257 = vminps_avx(auVar107,auVar7);
            auVar107 = vmaxps_avx(local_970,_local_990);
            auVar169 = ZEXT3264(local_4a0);
            auVar7 = vmaxps_avx(auVar145,auVar107);
            auVar145 = vandps_avx(auVar257,local_9a0);
            auVar107 = vandps_avx(auVar7,local_9a0);
            auVar145 = vmaxps_avx(auVar145,auVar107);
            auVar107 = vmovshdup_avx(auVar145);
            auVar107 = vmaxss_avx(auVar107,auVar145);
            auVar145 = vshufpd_avx(auVar145,auVar145,1);
            auVar145 = vmaxss_avx(auVar145,auVar107);
            fVar190 = auVar145._0_4_ * 1.9073486e-06;
            local_6a0 = vshufps_avx(auVar7,auVar7,0xff);
            local_740._4_4_ = fVar221 + local_4a0._4_4_;
            local_740._0_4_ = fVar220 + local_4a0._0_4_;
            fStack_738 = fVar222 + local_4a0._8_4_;
            fStack_734 = fVar223 + local_4a0._12_4_;
            fStack_730 = fVar279 + local_4a0._16_4_;
            fStack_72c = fVar280 + local_4a0._20_4_;
            fStack_728 = fVar281 + local_4a0._24_4_;
            fStack_724 = fVar238 + local_4a0._28_4_;
            _local_920 = local_4a0;
            do {
              auVar126._8_4_ = 0x7f800000;
              auVar126._0_8_ = 0x7f8000007f800000;
              auVar126._12_4_ = 0x7f800000;
              auVar126._16_4_ = 0x7f800000;
              auVar126._20_4_ = 0x7f800000;
              auVar126._24_4_ = 0x7f800000;
              auVar126._28_4_ = 0x7f800000;
              auVar271 = vblendvps_avx(auVar126,auVar169._0_32_,auVar112);
              auVar229 = vshufps_avx(auVar271,auVar271,0xb1);
              auVar229 = vminps_avx(auVar271,auVar229);
              auVar9 = vshufpd_avx(auVar229,auVar229,5);
              auVar229 = vminps_avx(auVar229,auVar9);
              auVar9 = vpermpd_avx2(auVar229,0x4e);
              auVar229 = vminps_avx(auVar229,auVar9);
              auVar229 = vcmpps_avx(auVar271,auVar229,0);
              auVar9 = auVar112 & auVar229;
              auVar271 = auVar112;
              if ((((((((auVar9 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar9 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar9 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar9 >> 0x7f,0) != '\0') ||
                    (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar9 >> 0xbf,0) != '\0') ||
                  (auVar9 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar9[0x1f] < '\0') {
                auVar271 = vandps_avx(auVar229,auVar112);
              }
              uVar85 = vmovmskps_avx(auVar271);
              iVar19 = 0;
              for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x80000000) {
                iVar19 = iVar19 + 1;
              }
              uVar86 = iVar19 << 2;
              local_640 = auVar112;
              *(undefined4 *)(local_640 + uVar86) = 0;
              aVar1 = (ray->dir).field_0;
              local_7e0._0_16_ = (undefined1  [16])aVar1;
              auVar145 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              uVar85 = *(uint *)(local_1c0 + uVar86);
              if (auVar145._0_4_ < 0.0) {
                local_a20._0_16_ = ZEXT416(*(uint *)(local_480 + uVar86));
                fVar94 = sqrtf(auVar145._0_4_);
                auVar145 = local_a20._0_16_;
              }
              else {
                auVar145 = vsqrtss_avx(auVar145,auVar145);
                fVar94 = auVar145._0_4_;
                auVar145 = ZEXT416(*(uint *)(local_480 + uVar86));
              }
              local_800._0_4_ = fVar94 * 1.9073486e-06;
              auVar145 = vinsertps_avx(auVar145,ZEXT416(uVar85),0x10);
              bVar92 = true;
              uVar87 = 0;
              do {
                fVar237 = auVar145._0_4_;
                auVar106._4_4_ = fVar237;
                auVar106._0_4_ = fVar237;
                auVar106._8_4_ = fVar237;
                auVar106._12_4_ = fVar237;
                auVar7 = vfmadd213ps_fma(auVar106,local_7e0._0_16_,_DAT_01f7aa10);
                local_8c0._0_16_ = vmovshdup_avx(auVar145);
                fVar235 = local_8c0._0_4_;
                fVar236 = 1.0 - fVar235;
                auVar277 = ZEXT464((uint)fVar236);
                fVar94 = fVar235 * fVar235;
                auVar99 = SUB6416(ZEXT464(0x40400000),0);
                auVar228 = SUB6416(ZEXT464(0xc0a00000),0);
                auVar257 = vfmadd213ss_fma(auVar99,local_8c0._0_16_,auVar228);
                auVar107 = vfmadd213ss_fma(auVar257,ZEXT416((uint)fVar94),
                                           SUB6416(ZEXT464(0x40000000),0));
                auVar8 = vfmadd213ss_fma(auVar99,ZEXT416((uint)fVar236),auVar228);
                auVar8 = vfmadd213ss_fma(auVar8,ZEXT416((uint)(fVar236 * fVar236)),
                                         SUB6416(ZEXT464(0x40000000),0));
                fVar226 = fVar236 * fVar236 * -fVar235 * 0.5;
                fVar233 = auVar107._0_4_ * 0.5;
                fVar234 = auVar8._0_4_ * 0.5;
                fVar235 = fVar235 * fVar235 * -fVar236 * 0.5;
                auVar178._0_4_ = fVar235 * (float)local_990._0_4_;
                auVar178._4_4_ = fVar235 * (float)local_990._4_4_;
                auVar178._8_4_ = fVar235 * fStack_988;
                auVar178._12_4_ = fVar235 * fStack_984;
                auVar196._4_4_ = fVar234;
                auVar196._0_4_ = fVar234;
                auVar196._8_4_ = fVar234;
                auVar196._12_4_ = fVar234;
                auVar107 = vfmadd132ps_fma(auVar196,auVar178,local_970);
                auVar151._4_4_ = fVar233;
                auVar151._0_4_ = fVar233;
                auVar151._8_4_ = fVar233;
                auVar151._12_4_ = fVar233;
                auVar107 = vfmadd132ps_fma(auVar151,auVar107,local_980);
                auVar179._4_4_ = fVar226;
                auVar179._0_4_ = fVar226;
                auVar179._8_4_ = fVar226;
                auVar179._12_4_ = fVar226;
                auVar107 = vfmadd132ps_fma(auVar179,auVar107,local_960);
                auVar228 = vfmadd231ss_fma(auVar228,local_8c0._0_16_,ZEXT416(0x41100000));
                auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),local_8c0._0_16_,
                                         ZEXT416(0x40800000));
                local_8e0._0_16_ = auVar8;
                local_660._0_16_ = auVar107;
                auVar107 = vsubps_avx(auVar7,auVar107);
                _local_8a0 = auVar107;
                auVar107 = vdpps_avx(auVar107,auVar107,0x7f);
                auVar7 = vfmadd213ss_fma(auVar99,local_8c0._0_16_,ZEXT416(0xbf800000));
                local_9c0._0_16_ = auVar7;
                local_a20._0_16_ = auVar107;
                if (auVar107._0_4_ < 0.0) {
                  local_9e0._0_4_ = auVar257._0_4_;
                  local_820._0_16_ = ZEXT416((uint)fVar236);
                  local_a00._0_4_ = fVar94;
                  local_900._0_16_ = auVar228;
                  local_840._0_4_ = fVar236 * -2.0;
                  auVar249._0_4_ = sqrtf(auVar107._0_4_);
                  auVar249._4_60_ = extraout_var_00;
                  auVar277 = ZEXT1664(local_820._0_16_);
                  auVar257 = ZEXT416((uint)local_9e0._0_4_);
                  auVar107 = auVar249._0_16_;
                  fVar226 = (float)local_840._0_4_;
                  fVar94 = (float)local_a00._0_4_;
                  auVar228 = local_900._0_16_;
                }
                else {
                  auVar107 = vsqrtss_avx(auVar107,auVar107);
                  fVar226 = fVar236 * -2.0;
                }
                fVar234 = auVar277._0_4_;
                fVar233 = local_8c0._0_4_;
                auVar257 = vfmadd213ss_fma(auVar257,ZEXT416((uint)(fVar233 + fVar233)),
                                           ZEXT416((uint)(fVar233 * fVar233 * 3.0)));
                auVar98 = SUB6416(ZEXT464(0x40000000),0);
                auVar7 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),local_8c0._0_16_,auVar98);
                auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar234 * fVar234 * -3.0)),
                                         ZEXT416((uint)(fVar234 + fVar234)),auVar7);
                auVar144 = auVar277._0_16_;
                auVar99 = vfnmadd231ss_fma(ZEXT416((uint)(fVar233 * (fVar234 + fVar234))),auVar144,
                                           auVar144);
                auVar7 = vfmadd213ss_fma(ZEXT416((uint)fVar226),local_8c0._0_16_,
                                         ZEXT416((uint)fVar94));
                fVar94 = auVar8._0_4_ * 0.5;
                fVar226 = auVar7._0_4_ * 0.5;
                auVar152._0_4_ = (float)local_990._0_4_ * fVar226;
                auVar152._4_4_ = (float)local_990._4_4_ * fVar226;
                auVar152._8_4_ = fStack_988 * fVar226;
                auVar152._12_4_ = fStack_984 * fVar226;
                auVar135._4_4_ = fVar94;
                auVar135._0_4_ = fVar94;
                auVar135._8_4_ = fVar94;
                auVar135._12_4_ = fVar94;
                auVar7 = vfmadd213ps_fma(auVar135,local_970,auVar152);
                fVar94 = auVar99._0_4_ * 0.5;
                fVar226 = auVar257._0_4_ * 0.5;
                auVar153._4_4_ = fVar226;
                auVar153._0_4_ = fVar226;
                auVar153._8_4_ = fVar226;
                auVar153._12_4_ = fVar226;
                auVar7 = vfmadd213ps_fma(auVar153,local_980,auVar7);
                auVar259._4_4_ = fVar94;
                auVar259._0_4_ = fVar94;
                auVar259._8_4_ = fVar94;
                auVar259._12_4_ = fVar94;
                auVar99 = vfmadd213ps_fma(auVar259,local_960,auVar7);
                auVar8 = vfmadd213ss_fma(local_8c0._0_16_,SUB6416(ZEXT464(0xc0400000),0),auVar98);
                auVar108._0_4_ = (float)local_990._0_4_ * (float)local_9c0._0_4_;
                auVar108._4_4_ = (float)local_990._4_4_ * (float)local_9c0._0_4_;
                auVar108._8_4_ = fStack_988 * (float)local_9c0._0_4_;
                auVar108._12_4_ = fStack_984 * (float)local_9c0._0_4_;
                auVar136._4_4_ = local_8e0._0_4_;
                auVar136._0_4_ = local_8e0._0_4_;
                auVar136._8_4_ = local_8e0._0_4_;
                auVar136._12_4_ = local_8e0._0_4_;
                auVar7 = vfmadd213ps_fma(auVar136,local_970,auVar108);
                uVar93 = auVar228._0_4_;
                auVar154._4_4_ = uVar93;
                auVar154._0_4_ = uVar93;
                auVar154._8_4_ = uVar93;
                auVar154._12_4_ = uVar93;
                auVar7 = vfmadd213ps_fma(auVar154,local_980,auVar7);
                auVar257 = vdpps_avx(auVar99,auVar99,0x7f);
                uVar93 = auVar8._0_4_;
                auVar137._4_4_ = uVar93;
                auVar137._0_4_ = uVar93;
                auVar137._8_4_ = uVar93;
                auVar137._12_4_ = uVar93;
                auVar228 = vfmadd213ps_fma(auVar137,local_960,auVar7);
                auVar7 = vblendps_avx(auVar257,_DAT_01f7aa10,0xe);
                auVar8 = vrsqrtss_avx(auVar7,auVar7);
                fVar233 = auVar257._0_4_;
                fVar94 = auVar8._0_4_;
                auVar8 = vdpps_avx(auVar99,auVar228,0x7f);
                fVar94 = fVar94 * 1.5 + fVar233 * -0.5 * fVar94 * fVar94 * fVar94;
                auVar138._0_4_ = auVar228._0_4_ * fVar233;
                auVar138._4_4_ = auVar228._4_4_ * fVar233;
                auVar138._8_4_ = auVar228._8_4_ * fVar233;
                auVar138._12_4_ = auVar228._12_4_ * fVar233;
                fVar226 = auVar8._0_4_;
                auVar214._0_4_ = auVar99._0_4_ * fVar226;
                auVar214._4_4_ = auVar99._4_4_ * fVar226;
                fVar234 = auVar99._8_4_;
                auVar214._8_4_ = fVar234 * fVar226;
                fVar235 = auVar99._12_4_;
                auVar214._12_4_ = fVar235 * fVar226;
                auVar8 = vsubps_avx(auVar138,auVar214);
                auVar7 = vrcpss_avx(auVar7,auVar7);
                auVar228 = vfnmadd213ss_fma(auVar7,auVar257,auVar98);
                fVar226 = auVar7._0_4_ * auVar228._0_4_;
                auVar7 = vmaxss_avx(ZEXT416((uint)fVar190),
                                    ZEXT416((uint)(fVar237 * (float)local_800._0_4_)));
                auVar169 = ZEXT1664(auVar7);
                local_9e0._0_8_ = auVar99._0_8_ ^ 0x8000000080000000;
                local_9e0._8_4_ = -fVar234;
                local_9e0._12_4_ = -fVar235;
                auVar180._0_4_ = fVar94 * auVar8._0_4_ * fVar226;
                auVar180._4_4_ = fVar94 * auVar8._4_4_ * fVar226;
                auVar180._8_4_ = fVar94 * auVar8._8_4_ * fVar226;
                auVar180._12_4_ = fVar94 * auVar8._12_4_ * fVar226;
                auVar241._0_4_ = auVar99._0_4_ * fVar94;
                auVar241._4_4_ = auVar99._4_4_ * fVar94;
                auVar241._8_4_ = fVar234 * fVar94;
                auVar241._12_4_ = fVar235 * fVar94;
                local_8c0._0_16_ = auVar99;
                local_8e0._0_4_ = auVar7._0_4_;
                if (fVar233 < -fVar233) {
                  local_9c0._0_4_ = auVar107._0_4_;
                  local_820._0_16_ = auVar241;
                  local_a00._0_16_ = auVar180;
                  auVar277 = ZEXT1664(auVar144);
                  fVar94 = sqrtf(fVar233);
                  auVar169 = ZEXT464((uint)local_8e0._0_4_);
                  auVar107 = ZEXT416((uint)local_9c0._0_4_);
                  auVar180 = local_a00._0_16_;
                  auVar241 = local_820._0_16_;
                }
                else {
                  auVar7 = vsqrtss_avx(auVar257,auVar257);
                  fVar94 = auVar7._0_4_;
                }
                auVar7 = vdpps_avx(_local_8a0,auVar241,0x7f);
                auVar228 = vfmadd213ss_fma(ZEXT416((uint)fVar190),auVar107,auVar169._0_16_);
                auVar257 = vdpps_avx(local_9e0._0_16_,auVar241,0x7f);
                auVar8 = vdpps_avx(_local_8a0,auVar180,0x7f);
                local_9c0._0_16_ = vdpps_avx(local_7e0._0_16_,auVar241,0x7f);
                auVar228 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                           ZEXT416((uint)(fVar190 / fVar94)),auVar228);
                auVar249 = ZEXT1664(auVar228);
                fVar94 = auVar257._0_4_ + auVar8._0_4_;
                auVar109._0_4_ = auVar7._0_4_ * auVar7._0_4_;
                auVar109._4_4_ = auVar7._4_4_ * auVar7._4_4_;
                auVar109._8_4_ = auVar7._8_4_ * auVar7._8_4_;
                auVar109._12_4_ = auVar7._12_4_ * auVar7._12_4_;
                auVar107 = vdpps_avx(_local_8a0,local_9e0._0_16_,0x7f);
                auVar8 = vsubps_avx(local_a20._0_16_,auVar109);
                auVar257 = vrsqrtss_avx(auVar8,auVar8);
                fVar233 = auVar8._0_4_;
                fVar226 = auVar257._0_4_;
                fVar226 = fVar226 * 1.5 + fVar233 * -0.5 * fVar226 * fVar226 * fVar226;
                auVar257 = vdpps_avx(_local_8a0,local_7e0._0_16_,0x7f);
                local_9e0._0_16_ = vfnmadd231ss_fma(auVar107,auVar7,ZEXT416((uint)fVar94));
                auVar107 = vfnmadd231ss_fma(auVar257,auVar7,local_9c0._0_16_);
                if (fVar233 < 0.0) {
                  local_820._0_16_ = auVar7;
                  local_a00._0_4_ = auVar228._0_4_;
                  local_900._0_16_ = ZEXT416((uint)fVar94);
                  local_840._0_4_ = fVar226;
                  local_680._0_16_ = auVar107;
                  auVar277 = ZEXT1664(auVar277._0_16_);
                  fVar233 = sqrtf(fVar233);
                  auVar249 = ZEXT464((uint)local_a00._0_4_);
                  auVar169 = ZEXT464((uint)local_8e0._0_4_);
                  fVar226 = (float)local_840._0_4_;
                  auVar107 = local_680._0_16_;
                  auVar7 = local_820._0_16_;
                  auVar257 = local_900._0_16_;
                }
                else {
                  auVar257 = vsqrtss_avx(auVar8,auVar8);
                  fVar233 = auVar257._0_4_;
                  auVar257 = ZEXT416((uint)fVar94);
                }
                auVar232 = ZEXT1664(auVar7);
                auVar264 = ZEXT1664(local_8c0._0_16_);
                auVar8 = vpermilps_avx(local_660._0_16_,0xff);
                fVar233 = fVar233 - auVar8._0_4_;
                auVar8 = vshufps_avx(local_8c0._0_16_,local_8c0._0_16_,0xff);
                auVar228 = vfmsub213ss_fma(local_9e0._0_16_,ZEXT416((uint)fVar226),auVar8);
                auVar269 = ZEXT1664(auVar228);
                auVar181._0_8_ = local_9c0._0_8_ ^ 0x8000000080000000;
                auVar181._8_4_ = local_9c0._8_4_ ^ 0x80000000;
                auVar181._12_4_ = local_9c0._12_4_ ^ 0x80000000;
                auVar197._0_8_ = auVar228._0_8_ ^ 0x8000000080000000;
                auVar197._8_4_ = auVar228._8_4_ ^ 0x80000000;
                auVar197._12_4_ = auVar228._12_4_ ^ 0x80000000;
                auVar107 = ZEXT416((uint)(auVar107._0_4_ * fVar226));
                auVar99 = vfmsub231ss_fma(ZEXT416((uint)(auVar228._0_4_ * local_9c0._0_4_)),auVar257
                                          ,auVar107);
                auVar107 = vinsertps_avx(auVar197,auVar107,0x1c);
                uVar93 = auVar99._0_4_;
                auVar198._4_4_ = uVar93;
                auVar198._0_4_ = uVar93;
                auVar198._8_4_ = uVar93;
                auVar198._12_4_ = uVar93;
                auVar107 = vdivps_avx(auVar107,auVar198);
                auVar257 = vinsertps_avx(auVar257,auVar181,0x10);
                auVar257 = vdivps_avx(auVar257,auVar198);
                fVar94 = auVar7._0_4_;
                auVar155._0_4_ = fVar94 * auVar107._0_4_ + fVar233 * auVar257._0_4_;
                auVar155._4_4_ = fVar94 * auVar107._4_4_ + fVar233 * auVar257._4_4_;
                auVar155._8_4_ = fVar94 * auVar107._8_4_ + fVar233 * auVar257._8_4_;
                auVar155._12_4_ = fVar94 * auVar107._12_4_ + fVar233 * auVar257._12_4_;
                auVar145 = vsubps_avx(auVar145,auVar155);
                auVar107 = vandps_avx(auVar7,local_9a0);
                if (auVar107._0_4_ < auVar249._0_4_) {
                  auVar257 = vfmadd231ss_fma(ZEXT416((uint)(auVar249._0_4_ + auVar169._0_4_)),
                                             local_6a0,ZEXT416(0x36000000));
                  auVar107 = vandps_avx(ZEXT416((uint)fVar233),local_9a0);
                  if (auVar107._0_4_ < auVar257._0_4_) {
                    fVar94 = auVar145._0_4_ + (float)local_7c0._0_4_;
                    bVar82 = 0;
                    bVar81 = 0;
                    if (fVar94 < (ray->org).field_0.m128[3]) goto LAB_01607342;
                    fVar226 = ray->tfar;
                    auVar169 = ZEXT3264(_local_920);
                    fVar220 = (float)local_a40._0_4_;
                    fVar221 = (float)local_a40._4_4_;
                    fVar222 = fStack_a38;
                    fVar223 = fStack_a34;
                    fVar279 = fStack_a30;
                    fVar280 = fStack_a2c;
                    fVar281 = fStack_a28;
                    fVar238 = fStack_a24;
                    if (fVar226 < fVar94) goto LAB_01607354;
                    auVar145 = vmovshdup_avx(auVar145);
                    bVar82 = 0;
                    fVar233 = auVar145._0_4_;
                    if ((fVar233 < 0.0) || (1.0 < fVar233)) goto LAB_01607354;
                    auVar145 = vrsqrtss_avx(local_a20._0_16_,local_a20._0_16_);
                    fVar234 = auVar145._0_4_;
                    pGVar4 = (context->scene->geometries).items[uVar83].ptr;
                    if ((pGVar4->mask & ray->mask) == 0) {
                      bVar82 = 0;
                      goto LAB_0160734b;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar82 = 1, pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_0160734b;
                    fVar234 = fVar234 * 1.5 + local_a20._0_4_ * -0.5 * fVar234 * fVar234 * fVar234;
                    auVar182._0_4_ = fVar234 * (float)local_8a0._0_4_;
                    auVar182._4_4_ = fVar234 * (float)local_8a0._4_4_;
                    auVar182._8_4_ = fVar234 * fStack_898;
                    auVar182._12_4_ = fVar234 * fStack_894;
                    auVar8 = vfmadd213ps_fma(auVar8,auVar182,local_8c0._0_16_);
                    auVar145 = vshufps_avx(auVar182,auVar182,0xc9);
                    auVar107 = vshufps_avx(local_8c0._0_16_,local_8c0._0_16_,0xc9);
                    auVar183._0_4_ = auVar182._0_4_ * auVar107._0_4_;
                    auVar183._4_4_ = auVar182._4_4_ * auVar107._4_4_;
                    auVar183._8_4_ = auVar182._8_4_ * auVar107._8_4_;
                    auVar183._12_4_ = auVar182._12_4_ * auVar107._12_4_;
                    auVar257 = vfmsub231ps_fma(auVar183,local_8c0._0_16_,auVar145);
                    auVar145 = vshufps_avx(auVar257,auVar257,0xc9);
                    auVar107 = vshufps_avx(auVar8,auVar8,0xc9);
                    auVar257 = vshufps_avx(auVar257,auVar257,0xd2);
                    auVar110._0_4_ = auVar8._0_4_ * auVar257._0_4_;
                    auVar110._4_4_ = auVar8._4_4_ * auVar257._4_4_;
                    auVar110._8_4_ = auVar8._8_4_ * auVar257._8_4_;
                    auVar110._12_4_ = auVar8._12_4_ * auVar257._12_4_;
                    auVar107 = vfmsub231ps_fma(auVar110,auVar145,auVar107);
                    auVar145 = vshufps_avx(auVar107,auVar107,0xe9);
                    local_880 = vmovlps_avx(auVar145);
                    local_878 = auVar107._0_4_;
                    local_870 = 0;
                    local_86c = (undefined4)local_848;
                    local_864 = context->user->instID[0];
                    local_860 = context->user->instPrimID[0];
                    ray->tfar = fVar94;
                    local_a44 = -1;
                    local_950.valid = &local_a44;
                    local_950.geometryUserPtr = pGVar4->userPtr;
                    local_950.context = context->user;
                    local_950.hit = (RTCHitN *)&local_880;
                    local_950.N = 1;
                    local_950.ray = (RTCRayN *)ray;
                    local_874 = fVar233;
                    local_868 = uVar83;
                    if (pGVar4->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01607578:
                      p_Var5 = context->args->filter;
                      if ((p_Var5 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar232 = ZEXT1664(auVar232._0_16_);
                        auVar249 = ZEXT1664(auVar249._0_16_);
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar269 = ZEXT1664(auVar269._0_16_);
                        auVar277 = ZEXT1664(auVar277._0_16_);
                        (*p_Var5)(&local_950);
                        if (*local_950.valid == 0) goto LAB_016075bf;
                      }
                      bVar81 = 1;
                    }
                    else {
                      auVar232 = ZEXT1664(auVar7);
                      auVar249 = ZEXT1664(auVar249._0_16_);
                      auVar264 = ZEXT1664(local_8c0._0_16_);
                      auVar269 = ZEXT1664(auVar228);
                      auVar277 = ZEXT1664(auVar277._0_16_);
                      (*pGVar4->occlusionFilterN)(&local_950);
                      if (*local_950.valid != 0) goto LAB_01607578;
LAB_016075bf:
                      ray->tfar = fVar226;
                      bVar81 = 0;
                    }
                    goto LAB_01607342;
                  }
                }
                bVar92 = uVar87 < 4;
                uVar87 = uVar87 + 1;
              } while (uVar87 != 5);
              bVar92 = false;
              bVar81 = 5;
LAB_01607342:
              bVar82 = bVar81;
LAB_0160734b:
              auVar169 = ZEXT3264(_local_920);
              fVar220 = (float)local_a40._0_4_;
              fVar221 = (float)local_a40._4_4_;
              fVar222 = fStack_a38;
              fVar223 = fStack_a34;
              fVar279 = fStack_a30;
              fVar280 = fStack_a2c;
              fVar281 = fStack_a28;
              fVar238 = fStack_a24;
LAB_01607354:
              bVar89 = (bool)(bVar89 | bVar92 & bVar82);
              fVar94 = ray->tfar;
              auVar124._4_4_ = fVar94;
              auVar124._0_4_ = fVar94;
              auVar124._8_4_ = fVar94;
              auVar124._12_4_ = fVar94;
              auVar124._16_4_ = fVar94;
              auVar124._20_4_ = fVar94;
              auVar124._24_4_ = fVar94;
              auVar124._28_4_ = fVar94;
              auVar271 = vcmpps_avx(_local_740,auVar124,2);
              auVar112 = vandps_avx(auVar271,local_640);
              auVar271 = local_640 & auVar271;
              local_640 = auVar112;
            } while ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar271 >> 0x7f,0) != '\0') ||
                       (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar271 >> 0xbf,0) != '\0') ||
                     (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar271[0x1f] < '\0');
          }
          auVar167._0_4_ = fVar220 + local_460._0_4_;
          auVar167._4_4_ = fVar221 + local_460._4_4_;
          auVar167._8_4_ = fVar222 + local_460._8_4_;
          auVar167._12_4_ = fVar223 + local_460._12_4_;
          auVar167._16_4_ = fVar279 + local_460._16_4_;
          auVar167._20_4_ = fVar280 + local_460._20_4_;
          auVar167._24_4_ = fVar281 + local_460._24_4_;
          auVar167._28_4_ = fVar238 + local_460._28_4_;
          auVar271 = vcmpps_avx(auVar167,auVar124,2);
          auVar112 = vandps_avx(local_5e0,local_500);
          auVar112 = vandps_avx(auVar271,auVar112);
          auVar189._0_4_ = fVar220 + local_4a0._0_4_;
          auVar189._4_4_ = fVar221 + local_4a0._4_4_;
          auVar189._8_4_ = fVar222 + local_4a0._8_4_;
          auVar189._12_4_ = fVar223 + local_4a0._12_4_;
          auVar189._16_4_ = fVar279 + local_4a0._16_4_;
          auVar189._20_4_ = fVar280 + local_4a0._20_4_;
          auVar189._24_4_ = fVar281 + local_4a0._24_4_;
          auVar189._28_4_ = fVar238 + local_4a0._28_4_;
          auVar229 = vcmpps_avx(auVar189,auVar124,2);
          auVar271 = vandps_avx(_local_780,local_760);
          auVar271 = vandps_avx(auVar229,auVar271);
          auVar271 = vorps_avx(auVar112,auVar271);
          if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar271 >> 0x7f,0) != '\0') ||
                (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar271 >> 0xbf,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar271[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar91 * 0x60) = auVar271;
            auVar112 = vblendvps_avx(local_4a0,local_460,auVar112);
            *(undefined1 (*) [32])(auStack_160 + uVar91 * 0x60) = auVar112;
            uVar95 = vmovlps_avx(local_4b0);
            (&uStack_140)[uVar91 * 0xc] = uVar95;
            aiStack_138[uVar91 * 0x18] = local_ac4 + 1;
            iVar90 = iVar90 + 1;
          }
        }
      }
    }
    fVar190 = ray->tfar;
    if (iVar90 == 0) break;
    fVar94 = ray->tfar;
    auVar139._4_4_ = fVar94;
    auVar139._0_4_ = fVar94;
    auVar139._8_4_ = fVar94;
    auVar139._12_4_ = fVar94;
    auVar139._16_4_ = fVar94;
    auVar139._20_4_ = fVar94;
    auVar139._24_4_ = fVar94;
    auVar139._28_4_ = fVar94;
    uVar85 = -iVar90;
    pauVar84 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar90 - 1) * 0x60);
    while( true ) {
      auVar112 = pauVar84[1];
      auVar162._0_4_ = fVar220 + auVar112._0_4_;
      auVar162._4_4_ = fVar221 + auVar112._4_4_;
      auVar162._8_4_ = fVar222 + auVar112._8_4_;
      auVar162._12_4_ = fVar223 + auVar112._12_4_;
      auVar162._16_4_ = fVar279 + auVar112._16_4_;
      auVar162._20_4_ = fVar280 + auVar112._20_4_;
      auVar162._24_4_ = fVar281 + auVar112._24_4_;
      auVar162._28_4_ = fVar238 + auVar112._28_4_;
      auVar229 = vcmpps_avx(auVar162,auVar139,2);
      auVar271 = vandps_avx(auVar229,*pauVar84);
      local_460 = auVar271;
      auVar229 = *pauVar84 & auVar229;
      if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar229 >> 0x7f,0) != '\0') ||
            (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar229 >> 0xbf,0) != '\0') ||
          (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar229[0x1f] < '\0') break;
      pauVar84 = pauVar84 + -3;
      uVar85 = uVar85 + 1;
      if (uVar85 == 0) goto LAB_0160776f;
    }
    auVar122._8_4_ = 0x7f800000;
    auVar122._0_8_ = 0x7f8000007f800000;
    auVar122._12_4_ = 0x7f800000;
    auVar122._16_4_ = 0x7f800000;
    auVar122._20_4_ = 0x7f800000;
    auVar122._24_4_ = 0x7f800000;
    auVar122._28_4_ = 0x7f800000;
    auVar112 = vblendvps_avx(auVar122,auVar112,auVar271);
    auVar229 = vshufps_avx(auVar112,auVar112,0xb1);
    auVar229 = vminps_avx(auVar112,auVar229);
    auVar9 = vshufpd_avx(auVar229,auVar229,5);
    auVar229 = vminps_avx(auVar229,auVar9);
    auVar9 = vpermpd_avx2(auVar229,0x4e);
    auVar229 = vminps_avx(auVar229,auVar9);
    auVar112 = vcmpps_avx(auVar112,auVar229,0);
    auVar229 = auVar271 & auVar112;
    if ((((((((auVar229 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar229 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar229 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar229 >> 0x7f,0) != '\0') ||
          (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar229 >> 0xbf,0) != '\0') ||
        (auVar229 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar229[0x1f] < '\0') {
      auVar271 = vandps_avx(auVar112,auVar271);
    }
    uVar87 = *(ulong *)pauVar84[2];
    auVar101._8_8_ = 0;
    auVar101._0_8_ = uVar87;
    uVar86 = vmovmskps_avx(auVar271);
    iVar90 = 0;
    for (; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x80000000) {
      iVar90 = iVar90 + 1;
    }
    *(undefined4 *)(local_460 + (uint)(iVar90 << 2)) = 0;
    uVar86 = ~uVar85;
    if ((((((((local_460 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_460 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_460 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_460 >> 0x7f,0) != '\0') ||
          (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_460 >> 0xbf,0) != '\0') ||
        (local_460 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_460[0x1f] < '\0') {
      uVar86 = -uVar85;
    }
    uVar91 = (ulong)uVar86;
    local_ac4 = *(int *)(pauVar84[2] + 8);
    *pauVar84 = local_460;
    uVar93 = (undefined4)uVar87;
    auVar140._4_4_ = uVar93;
    auVar140._0_4_ = uVar93;
    auVar140._8_4_ = uVar93;
    auVar140._12_4_ = uVar93;
    auVar140._16_4_ = uVar93;
    auVar140._20_4_ = uVar93;
    auVar140._24_4_ = uVar93;
    auVar140._28_4_ = uVar93;
    auVar145 = vmovshdup_avx(auVar101);
    auVar145 = vsubps_avx(auVar145,auVar101);
    auVar123._0_4_ = auVar145._0_4_;
    auVar123._4_4_ = auVar123._0_4_;
    auVar123._8_4_ = auVar123._0_4_;
    auVar123._12_4_ = auVar123._0_4_;
    auVar123._16_4_ = auVar123._0_4_;
    auVar123._20_4_ = auVar123._0_4_;
    auVar123._24_4_ = auVar123._0_4_;
    auVar123._28_4_ = auVar123._0_4_;
    auVar169 = ZEXT3264(_DAT_01faff20);
    auVar145 = vfmadd132ps_fma(auVar123,auVar140,_DAT_01faff20);
    local_4a0 = ZEXT1632(auVar145);
    auVar225 = ZEXT864(*(ulong *)(local_4a0 + (uint)(iVar90 << 2)));
  } while( true );
LAB_0160776f:
  if (bVar89 != false) {
    return bVar89;
  }
  auVar111._4_4_ = fVar190;
  auVar111._0_4_ = fVar190;
  auVar111._8_4_ = fVar190;
  auVar111._12_4_ = fVar190;
  auVar145 = vcmpps_avx(local_4c0,auVar111,2);
  uVar83 = vmovmskps_avx(auVar145);
  uVar83 = (uint)local_7a8 & uVar83;
  if (uVar83 == 0) {
    return false;
  }
  goto LAB_01605026;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));
         
          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }